

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O2

void embree::sse42::InstanceIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive *prim)

{
  RayHitK<4> *pRVar1;
  AffineSpace3ff *pAVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  Vector *pVVar7;
  Vector *pVVar8;
  Instance *pIVar9;
  RTCRayQueryContext *pRVar10;
  AffineSpace3ff *pAVar11;
  AffineSpace3ff *pAVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [16];
  uint uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  float fVar28;
  uint uVar29;
  float fVar48;
  float fVar51;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar54;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar49;
  uint uVar52;
  uint uVar55;
  undefined1 auVar37 [16];
  uint uVar50;
  uint uVar53;
  uint uVar56;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar57;
  float fVar58;
  float fVar72;
  float fVar73;
  undefined1 auVar59 [16];
  float fVar74;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  float fVar94;
  float fVar95;
  undefined1 auVar76 [16];
  float fVar96;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar109;
  float fVar121;
  float fVar122;
  undefined1 in_XMM4 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar123;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  float fVar189;
  float fVar190;
  undefined1 in_XMM6 [16];
  float fVar191;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar192;
  float fVar200;
  float fVar201;
  undefined1 in_XMM7 [16];
  float fVar203;
  undefined1 auVar193 [16];
  float fVar202;
  float fVar204;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar214;
  float fVar219;
  float fVar221;
  undefined1 in_XMM9 [16];
  float fVar220;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar225;
  float fVar228;
  float fVar229;
  undefined1 in_XMM10 [16];
  float fVar230;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar236;
  float fVar237;
  undefined1 auVar232 [16];
  float fVar238;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  int iVar239;
  float fVar240;
  int iVar247;
  int iVar249;
  undefined1 in_XMM12 [16];
  float fVar248;
  float fVar250;
  int iVar251;
  float fVar252;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar253;
  float fVar259;
  float fVar260;
  undefined1 in_XMM13 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar275;
  float fVar278;
  undefined1 in_XMM14 [16];
  float fVar281;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar276;
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar284;
  float fVar285;
  float fVar289;
  float fVar291;
  undefined1 in_XMM15 [16];
  float fVar294;
  undefined1 auVar286 [16];
  float fVar290;
  float fVar292;
  float fVar295;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  ulong uVar293;
  RayQueryContext newcontext;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float fStack_154;
  float local_148;
  float fStack_130;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  RTCIntersectArguments *local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  pIVar9 = prim->instance;
  uVar24 = (pIVar9->super_Geometry).mask;
  auVar232._0_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x90)) == 0);
  auVar232._4_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x94)) == 0);
  auVar232._8_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x98)) == 0);
  auVar232._12_4_ = -(uint)((uVar24 & *(uint *)(ray + 0x9c)) == 0);
  auVar232 = ~auVar232 & (undefined1  [16])valid_i->field_0;
  uVar24 = movmskps((int)ray,auVar232);
  if ((uVar24 != 0) && (pRVar10 = context->user, pRVar10->instID[0] == 0xffffffff)) {
    pRVar10->instID[0] = prim->instID_;
    pRVar10->instPrimID[0] = 0;
    uVar29 = (uint)(byte)(pIVar9->super_Geometry).field_8.field_0x1;
    local_58 = auVar232;
    auVar23 = local_58;
    local_58._0_8_ = auVar232._0_8_;
    local_58._8_8_ = auVar232._8_8_;
    if (uVar29 == 1) {
      fVar109 = (pIVar9->super_Geometry).fnumTimeSegments;
      fVar121 = (pIVar9->super_Geometry).time_range.lower;
      auVar114._0_4_ = (pIVar9->super_Geometry).time_range.upper - fVar121;
      auVar99._4_4_ = fVar121;
      auVar99._0_4_ = fVar121;
      auVar99._8_4_ = fVar121;
      auVar99._12_4_ = fVar121;
      auVar125._4_4_ = fVar109;
      auVar125._0_4_ = fVar109;
      auVar125._8_4_ = fVar109;
      auVar125._12_4_ = fVar109;
      auVar206._0_4_ = *(float *)(ray + 0x70) - fVar121;
      auVar206._4_4_ = *(float *)(ray + 0x74) - fVar121;
      auVar206._8_4_ = *(float *)(ray + 0x78) - fVar121;
      auVar206._12_4_ = *(float *)(ray + 0x7c) - fVar121;
      auVar114._4_4_ = auVar114._0_4_;
      auVar114._8_4_ = auVar114._0_4_;
      auVar114._12_4_ = auVar114._0_4_;
      auVar111 = divps(auVar206,auVar114);
      auVar242._0_4_ = auVar111._0_4_ * fVar109;
      auVar242._4_4_ = auVar111._4_4_ * fVar109;
      auVar242._8_4_ = auVar111._8_4_ * fVar109;
      auVar242._12_4_ = auVar111._12_4_ * fVar109;
      auVar99 = roundps(auVar99,auVar242,1);
      auVar111._0_4_ = fVar109 + -1.0;
      auVar111._4_4_ = auVar111._0_4_;
      auVar111._8_4_ = auVar111._0_4_;
      auVar111._12_4_ = auVar111._0_4_;
      auVar111 = minps(auVar99,auVar111);
      auVar268._0_12_ = ZEXT812(0);
      auVar268._12_4_ = 0;
      auVar111 = maxps(auVar111,auVar268);
      fVar109 = auVar242._0_4_ - auVar111._0_4_;
      fVar121 = auVar242._4_4_ - auVar111._4_4_;
      fVar122 = auVar242._8_4_ - auVar111._8_4_;
      fVar123 = auVar242._12_4_ - auVar111._12_4_;
      iVar239 = (int)auVar111._0_4_;
      iVar247 = (int)auVar111._4_4_;
      iVar249 = (int)auVar111._8_4_;
      iVar251 = (int)auVar111._12_4_;
      local_a8 = CONCAT44(iVar247,iVar239);
      uStack_a0 = (RTCRayQueryContext *)CONCAT44(iVar251,iVar249);
      lVar25 = 0;
      if ((uVar24 & 0xff) != 0) {
        for (; ((uVar24 & 0xff) >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
        }
      }
      iVar27 = *(int *)((long)&local_a8 + lVar25 * 4);
      lVar25 = (long)iVar27;
      auVar255._0_4_ = -(uint)(iVar27 == iVar239);
      auVar255._4_4_ = -(uint)(iVar27 == iVar247);
      auVar255._8_4_ = -(uint)(iVar27 == iVar249);
      auVar255._12_4_ = -(uint)(iVar27 == iVar251);
      iVar27 = movmskps(0x100,~auVar255 & auVar232);
      auVar99 = auVar232;
      if (iVar27 == 0) {
        pAVar12 = pIVar9->local2world;
        pAVar2 = pAVar12 + lVar25;
        fVar74 = (pAVar2->l).vx.field_0.m128[1];
        fVar97 = (pAVar2->l).vx.field_0.m128[2];
        fVar202 = (pAVar2->l).vx.field_0.m128[3];
        pVVar3 = &pAVar12[lVar25].p;
        fVar204 = (pVVar3->field_0).m128[1];
        local_78._4_4_ = *(float *)((long)&pVVar3->field_0 + 0xc);
        local_78._0_4_ = local_78._4_4_;
        fStack_70 = (float)local_78._4_4_;
        fStack_6c = (float)local_78._4_4_;
        pAVar11 = pAVar12 + lVar25 + 1;
        fVar58 = (pAVar11->l).vx.field_0.m128[3];
        auVar78._4_4_ = fVar58;
        auVar78._0_4_ = fVar58;
        auVar78._8_4_ = fVar58;
        auVar78._12_4_ = fVar58;
        pVVar4 = &pAVar12[lVar25 + 1].p;
        fVar28 = *(float *)((long)&pVVar4->field_0 + 0xc);
        auVar215._4_4_ = fVar28;
        auVar215._0_4_ = fVar28;
        auVar215._8_4_ = fVar28;
        auVar215._12_4_ = fVar28;
        pVVar5 = &pAVar12[lVar25].l.vy;
        fVar48 = (pVVar5->field_0).m128[1];
        fVar51 = (pVVar5->field_0).m128[2];
        fVar108 = *(float *)((long)&pVVar5->field_0 + 0xc);
        pVVar6 = &pAVar12[lVar25 + 1].l.vy;
        local_68 = (pVVar6->field_0).m128[0];
        fStack_64 = (pVVar6->field_0).m128[1];
        fStack_60 = (pVVar6->field_0).m128[2];
        fStack_5c = *(float *)((long)&pVVar6->field_0 + 0xc);
        auVar194._4_4_ = fStack_5c;
        auVar194._0_4_ = fStack_5c;
        auVar194._8_4_ = fStack_5c;
        auVar194._12_4_ = fStack_5c;
        pVVar7 = &pAVar12[lVar25].l.vz;
        fVar220 = (pVVar7->field_0).m128[1];
        fVar222 = (pVVar7->field_0).m128[2];
        fVar224 = *(float *)((long)&pVVar7->field_0 + 0xc);
        pVVar8 = &pAVar12[lVar25 + 1].l.vz;
        fVar54 = *(float *)((long)&pVVar8->field_0 + 0xc);
        auVar286._4_4_ = fVar54;
        auVar286._0_4_ = fVar54;
        auVar286._8_4_ = fVar54;
        auVar286._12_4_ = fVar54;
        auVar100._0_4_ =
             fVar224 * fVar54 +
             fVar108 * fStack_5c + fVar202 * fVar58 + (float)local_78._4_4_ * fVar28;
        auVar100._4_4_ =
             fVar224 * fVar54 +
             fVar108 * fStack_5c + fVar202 * fVar58 + (float)local_78._4_4_ * fVar28;
        auVar100._8_4_ =
             fVar224 * fVar54 +
             fVar108 * fStack_5c + fVar202 * fVar58 + (float)local_78._4_4_ * fVar28;
        auVar100._12_4_ =
             fVar224 * fVar54 +
             fVar108 * fStack_5c + fVar202 * fVar58 + (float)local_78._4_4_ * fVar28;
        uVar293 = CONCAT44(auVar100._4_4_,auVar100._0_4_);
        auVar32._4_4_ = -(uint)(auVar100._4_4_ < -auVar100._4_4_);
        auVar32._0_4_ = -(uint)(auVar100._0_4_ < -auVar100._0_4_);
        auVar32._8_4_ = -(uint)(auVar100._8_4_ < -auVar100._8_4_);
        auVar32._12_4_ = -(uint)(auVar100._12_4_ < -auVar100._12_4_);
        auVar243._8_4_ = -auVar100._8_4_;
        auVar243._0_8_ = uVar293 ^ 0x8000000080000000;
        auVar243._12_4_ = -auVar100._12_4_;
        auVar61._0_8_ = CONCAT44(fVar28,fVar28) ^ 0x8000000080000000;
        auVar61._8_4_ = -fVar28;
        auVar61._12_4_ = -fVar28;
        auVar114 = blendvps(auVar215,auVar61,auVar32);
        auVar62._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
        auVar62._8_4_ = -fVar58;
        auVar62._12_4_ = -fVar58;
        auVar111 = blendvps(auVar78,auVar62,auVar32);
        auVar63._0_8_ = CONCAT44(fStack_5c,fStack_5c) ^ 0x8000000080000000;
        auVar63._8_4_ = -fStack_5c;
        auVar63._12_4_ = -fStack_5c;
        auVar99 = blendvps(auVar194,auVar63,auVar32);
        auVar64._0_8_ = CONCAT44(fVar54,fVar54) ^ 0x8000000080000000;
        auVar64._8_4_ = -fVar54;
        auVar64._12_4_ = -fVar54;
        auVar268 = blendvps(auVar286,auVar64,auVar32);
        local_38 = maxps(auVar243,auVar100);
        fVar58 = ABS(auVar100._0_4_);
        fVar28 = ABS(auVar100._4_4_);
        uVar293 = CONCAT44(auVar100._4_4_,auVar100._0_4_);
        auVar101._0_8_ = uVar293 & 0x7fffffff7fffffff;
        auVar101._8_4_ = ABS(auVar100._8_4_);
        auVar101._12_4_ = ABS(auVar100._12_4_);
        auVar65._0_4_ = 1.0 - fVar58;
        auVar65._4_4_ = 1.0 - fVar28;
        auVar65._8_4_ = 1.0 - auVar101._8_4_;
        auVar65._12_4_ = 1.0 - auVar101._12_4_;
        auVar232 = sqrtps(auVar65,auVar65);
        auVar33._0_4_ =
             1.5707964 -
             auVar232._0_4_ *
             (((((fVar58 * -0.0043095737 + 0.0192803) * fVar58 + -0.04489909) * fVar58 + 0.08785567)
               * fVar58 + -0.21450998) * fVar58 + 1.5707952);
        auVar33._4_4_ =
             1.5707964 -
             auVar232._4_4_ *
             (((((fVar28 * -0.0043095737 + 0.0192803) * fVar28 + -0.04489909) * fVar28 + 0.08785567)
               * fVar28 + -0.21450998) * fVar28 + 1.5707952);
        auVar33._8_4_ =
             1.5707964 -
             auVar232._8_4_ *
             (((((auVar101._8_4_ * -0.0043095737 + 0.0192803) * auVar101._8_4_ + -0.04489909) *
                auVar101._8_4_ + 0.08785567) * auVar101._8_4_ + -0.21450998) * auVar101._8_4_ +
             1.5707952);
        auVar33._12_4_ =
             1.5707964 -
             auVar232._12_4_ *
             (((((auVar101._12_4_ * -0.0043095737 + 0.0192803) * auVar101._12_4_ + -0.04489909) *
                auVar101._12_4_ + 0.08785567) * auVar101._12_4_ + -0.21450998) * auVar101._12_4_ +
             1.5707952);
        auVar232 = maxps(ZEXT816(0),auVar33);
        fVar236 = local_38._0_4_;
        fVar238 = local_38._4_4_;
        fVar248 = local_38._8_4_;
        fVar252 = local_38._12_4_;
        auVar34._4_4_ = -(uint)(fVar238 < 0.0);
        auVar34._0_4_ = -(uint)(fVar236 < 0.0);
        auVar34._8_4_ = -(uint)(fVar248 < 0.0);
        auVar34._12_4_ = -(uint)(fVar252 < 0.0);
        auVar66._0_8_ = auVar232._0_8_ ^ 0x8000000080000000;
        auVar66._8_4_ = auVar232._8_4_ ^ 0x80000000;
        auVar66._12_4_ = auVar232._12_4_ ^ 0x80000000;
        auVar232 = blendvps(auVar232,auVar66,auVar34);
        auVar115._0_4_ = 1.5707964 - auVar232._0_4_;
        auVar115._4_4_ = 1.5707964 - auVar232._4_4_;
        auVar115._8_4_ = 1.5707964 - auVar232._8_4_;
        auVar115._12_4_ = 1.5707964 - auVar232._12_4_;
        auVar35._4_4_ = -(uint)(1.0 < fVar28);
        auVar35._0_4_ = -(uint)(1.0 < fVar58);
        auVar35._8_4_ = -(uint)(1.0 < auVar101._8_4_);
        auVar35._12_4_ = -(uint)(1.0 < auVar101._12_4_);
        auVar232 = blendvps(auVar115,_DAT_01f4bc50,auVar35);
        fVar72 = auVar232._0_4_ * fVar109;
        fVar73 = auVar232._4_4_ * fVar121;
        fVar75 = auVar232._8_4_ * fVar122;
        fVar94 = auVar232._12_4_ * fVar123;
        auVar36._0_4_ = fVar72 * 0.63661975;
        auVar36._4_4_ = fVar73 * 0.63661975;
        auVar36._8_4_ = fVar75 * 0.63661975;
        auVar36._12_4_ = fVar94 * 0.63661975;
        auVar232 = roundps(auVar101,auVar36,1);
        uVar24 = (uint)auVar232._0_4_;
        uVar49 = (uint)auVar232._4_4_;
        uVar52 = (uint)auVar232._8_4_;
        uVar55 = (uint)auVar232._12_4_;
        fVar72 = fVar72 - auVar232._0_4_ * 1.5707964;
        fVar73 = fVar73 - auVar232._4_4_ * 1.5707964;
        fVar75 = fVar75 - auVar232._8_4_ * 1.5707964;
        fVar94 = fVar94 - auVar232._12_4_ * 1.5707964;
        uVar29 = uVar24 & 3;
        uVar50 = uVar49 & 3;
        uVar53 = uVar52 & 3;
        uVar56 = uVar55 & 3;
        fVar58 = fVar72 * fVar72;
        fVar28 = fVar73 * fVar73;
        fVar54 = fVar75 * fVar75;
        fVar57 = fVar94 * fVar94;
        uVar24 = uVar24 & 1;
        uVar49 = uVar49 & 1;
        uVar52 = uVar52 & 1;
        uVar55 = uVar55 & 1;
        auVar79._0_4_ = -(uint)(uVar24 == 0);
        auVar79._4_4_ = -(uint)(uVar49 == 0);
        auVar79._8_4_ = -(uint)(uVar52 == 0);
        auVar79._12_4_ = -(uint)(uVar55 == 0);
        auVar269._4_4_ = -uVar49;
        auVar269._0_4_ = -uVar24;
        auVar269._8_4_ = -uVar52;
        auVar269._12_4_ = -uVar55;
        auVar233._0_8_ =
             CONCAT44((((((fVar28 * -2.5029328e-08 + 2.7600126e-06) * fVar28 + -0.00019842605) *
                         fVar28 + 0.008333348) * fVar28 + -0.16666667) * fVar28 + 1.0) * fVar73,
                      (((((fVar58 * -2.5029328e-08 + 2.7600126e-06) * fVar58 + -0.00019842605) *
                         fVar58 + 0.008333348) * fVar58 + -0.16666667) * fVar58 + 1.0) * fVar72);
        auVar233._8_4_ =
             (((((fVar54 * -2.5029328e-08 + 2.7600126e-06) * fVar54 + -0.00019842605) * fVar54 +
               0.008333348) * fVar54 + -0.16666667) * fVar54 + 1.0) * fVar75;
        auVar233._12_4_ =
             (((((fVar57 * -2.5029328e-08 + 2.7600126e-06) * fVar57 + -0.00019842605) * fVar57 +
               0.008333348) * fVar57 + -0.16666667) * fVar57 + 1.0) * fVar94;
        auVar207._0_4_ =
             ((((fVar58 * -2.5963018e-07 + 2.4756235e-05) * fVar58 + -0.001388833) * fVar58 +
              0.04166664) * fVar58 + -0.5) * fVar58 + 1.0;
        auVar207._4_4_ =
             ((((fVar28 * -2.5963018e-07 + 2.4756235e-05) * fVar28 + -0.001388833) * fVar28 +
              0.04166664) * fVar28 + -0.5) * fVar28 + 1.0;
        auVar207._8_4_ =
             ((((fVar54 * -2.5963018e-07 + 2.4756235e-05) * fVar54 + -0.001388833) * fVar54 +
              0.04166664) * fVar54 + -0.5) * fVar54 + 1.0;
        auVar207._12_4_ =
             ((((fVar57 * -2.5963018e-07 + 2.4756235e-05) * fVar57 + -0.001388833) * fVar57 +
              0.04166664) * fVar57 + -0.5) * fVar57 + 1.0;
        auVar116._8_4_ = auVar233._8_4_;
        auVar116._0_8_ = auVar233._0_8_;
        auVar116._12_4_ = auVar233._12_4_;
        auVar232 = blendvps(auVar116,auVar207,auVar269);
        auVar125 = blendvps(auVar233,auVar207,auVar79);
        auVar37._0_4_ = -(uint)(1 < uVar29);
        auVar37._4_4_ = -(uint)(1 < uVar50);
        auVar37._8_4_ = -(uint)(1 < uVar53);
        auVar37._12_4_ = -(uint)(1 < uVar56);
        auVar67._0_8_ = auVar232._0_8_ ^ 0x8000000080000000;
        auVar67._8_4_ = auVar232._8_4_ ^ 0x80000000;
        auVar67._12_4_ = auVar232._12_4_ ^ 0x80000000;
        local_48 = blendvps(auVar232,auVar67,auVar37);
        fVar191 = local_48._12_4_;
        uVar29 = uVar29 - 1;
        uVar50 = uVar50 - 1;
        uVar53 = uVar53 - 1;
        uVar56 = uVar56 - 1;
        auVar102._0_4_ = -(uint)(((uVar29 == 0) * uVar29 | (uint)(uVar29 != 0)) == uVar29);
        auVar102._4_4_ = -(uint)(((uVar50 == 0) * uVar50 | (uint)(uVar50 != 0)) == uVar50);
        auVar102._8_4_ = -(uint)(((uVar53 == 0) * uVar53 | (uint)(uVar53 != 0)) == uVar53);
        auVar102._12_4_ = -(uint)(((uVar56 == 0) * uVar56 | (uint)(uVar56 != 0)) == uVar56);
        auVar163._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
        auVar163._8_4_ = auVar125._8_4_ ^ 0x80000000;
        auVar163._12_4_ = auVar125._12_4_ ^ 0x80000000;
        auVar125 = blendvps(auVar125,auVar163,auVar102);
        fVar162 = (float)local_78._4_4_ * fVar236 - auVar114._0_4_;
        fVar189 = (float)local_78._4_4_ * fVar238 - auVar114._4_4_;
        fVar190 = (float)local_78._4_4_ * fVar248 - auVar114._8_4_;
        fVar192 = (float)local_78._4_4_ * fVar252 - auVar114._12_4_;
        local_1f8._0_4_ = auVar111._0_4_;
        local_1f8._4_4_ = auVar111._4_4_;
        fStack_1f0 = auVar111._8_4_;
        fStack_1ec = auVar111._12_4_;
        fVar72 = fVar202 * fVar236 - (float)local_1f8._0_4_;
        fVar73 = fVar202 * fVar238 - (float)local_1f8._4_4_;
        fVar75 = fVar202 * fVar248 - fStack_1f0;
        fVar94 = fVar202 * fVar252 - fStack_1ec;
        fVar95 = fVar108 * fVar236 - auVar99._0_4_;
        fVar96 = fVar108 * fVar238 - auVar99._4_4_;
        fVar106 = fVar108 * fVar248 - auVar99._8_4_;
        fVar107 = fVar108 * fVar252 - auVar99._12_4_;
        local_88._0_4_ = fVar224 * fVar236 - auVar268._0_4_;
        local_88._4_4_ = fVar224 * fVar238 - auVar268._4_4_;
        fStack_80 = fVar224 * fVar248 - auVar268._8_4_;
        fStack_7c = fVar224 * fVar252 - auVar268._12_4_;
        auVar68._0_4_ =
             (float)local_88._0_4_ * (float)local_88._0_4_ +
             fVar95 * fVar95 + fVar72 * fVar72 + fVar162 * fVar162;
        auVar68._4_4_ =
             (float)local_88._4_4_ * (float)local_88._4_4_ +
             fVar96 * fVar96 + fVar73 * fVar73 + fVar189 * fVar189;
        auVar68._8_4_ =
             fStack_80 * fStack_80 + fVar106 * fVar106 + fVar75 * fVar75 + fVar190 * fVar190;
        auVar68._12_4_ =
             fStack_7c * fStack_7c + fVar107 * fVar107 + fVar94 * fVar94 + fVar192 * fVar192;
        auVar232 = rsqrtps(local_48,auVar68);
        fVar58 = auVar232._0_4_;
        fVar28 = auVar232._4_4_;
        fVar54 = auVar232._8_4_;
        fVar57 = auVar232._12_4_;
        fVar237 = fVar58 * 1.5 - fVar58 * fVar58 * auVar68._0_4_ * 0.5 * fVar58;
        fVar240 = fVar28 * 1.5 - fVar28 * fVar28 * auVar68._4_4_ * 0.5 * fVar28;
        fVar250 = fVar54 * 1.5 - fVar54 * fVar54 * auVar68._8_4_ * 0.5 * fVar54;
        fVar264 = fVar57 * 1.5 - fVar57 * fVar57 * auVar68._12_4_ * 0.5 * fVar57;
        fVar275 = local_48._0_4_;
        fVar278 = local_48._4_4_;
        fVar281 = local_48._8_4_;
        fVar219 = (auVar114._0_4_ - (float)local_78._4_4_) * fVar109 + (float)local_78._4_4_;
        fVar221 = (auVar114._4_4_ - (float)local_78._4_4_) * fVar121 + (float)local_78._4_4_;
        fVar223 = (auVar114._8_4_ - (float)local_78._4_4_) * fVar122 + (float)local_78._4_4_;
        fVar225 = (auVar114._12_4_ - (float)local_78._4_4_) * fVar123 + (float)local_78._4_4_;
        fVar228 = auVar125._0_4_;
        fVar229 = auVar125._4_4_;
        fVar230 = auVar125._8_4_;
        fVar231 = auVar125._12_4_;
        auVar270._0_4_ = (float)local_78._4_4_ * fVar228 - fVar162 * fVar237 * fVar275;
        auVar270._4_4_ = (float)local_78._4_4_ * fVar229 - fVar189 * fVar240 * fVar278;
        auVar270._8_4_ = (float)local_78._4_4_ * fVar230 - fVar190 * fVar250 * fVar281;
        auVar270._12_4_ = (float)local_78._4_4_ * fVar231 - fVar192 * fVar264 * fVar191;
        fVar58 = ((float)local_1f8._0_4_ - fVar202) * fVar109 + fVar202;
        fVar28 = ((float)local_1f8._4_4_ - fVar202) * fVar121 + fVar202;
        fVar54 = (fStack_1f0 - fVar202) * fVar122 + fVar202;
        fVar57 = (fStack_1ec - fVar202) * fVar123 + fVar202;
        fVar200 = (auVar99._0_4_ - fVar108) * fVar109 + fVar108;
        fVar201 = (auVar99._4_4_ - fVar108) * fVar121 + fVar108;
        fVar203 = (auVar99._8_4_ - fVar108) * fVar122 + fVar108;
        fVar214 = (auVar99._12_4_ - fVar108) * fVar123 + fVar108;
        auVar117._0_4_ = fVar200 * fVar200 + fVar58 * fVar58 + fVar219 * fVar219;
        auVar117._4_4_ = fVar201 * fVar201 + fVar28 * fVar28 + fVar221 * fVar221;
        auVar117._8_4_ = fVar203 * fVar203 + fVar54 * fVar54 + fVar223 * fVar223;
        auVar117._12_4_ = fVar214 * fVar214 + fVar57 * fVar57 + fVar225 * fVar225;
        fVar284 = (auVar268._0_4_ - fVar224) * fVar109 + fVar224;
        fVar289 = (auVar268._4_4_ - fVar224) * fVar121 + fVar224;
        fVar291 = (auVar268._8_4_ - fVar224) * fVar122 + fVar224;
        fVar294 = (auVar268._12_4_ - fVar224) * fVar123 + fVar224;
        auVar164._0_4_ = fVar284 * fVar284 + auVar117._0_4_;
        auVar164._4_4_ = fVar289 * fVar289 + auVar117._4_4_;
        auVar164._8_4_ = fVar291 * fVar291 + auVar117._8_4_;
        auVar164._12_4_ = fVar294 * fVar294 + auVar117._12_4_;
        auVar232 = rsqrtps(auVar117,auVar164);
        fVar162 = auVar232._0_4_;
        fVar189 = auVar232._4_4_;
        fVar190 = auVar232._8_4_;
        fVar192 = auVar232._12_4_;
        fVar162 = fVar162 * 1.5 - fVar162 * fVar162 * auVar164._0_4_ * 0.5 * fVar162;
        fVar189 = fVar189 * 1.5 - fVar189 * fVar189 * auVar164._4_4_ * 0.5 * fVar189;
        fVar190 = fVar190 * 1.5 - fVar190 * fVar190 * auVar164._8_4_ * 0.5 * fVar190;
        fVar192 = fVar192 * 1.5 - fVar192 * fVar192 * auVar164._12_4_ * 0.5 * fVar192;
        auVar216._0_4_ = fVar219 * fVar162;
        auVar216._4_4_ = fVar221 * fVar189;
        auVar216._8_4_ = fVar223 * fVar190;
        auVar216._12_4_ = fVar225 * fVar192;
        auVar38._4_4_ = -(uint)(0.9995 < fVar238);
        auVar38._0_4_ = -(uint)(0.9995 < fVar236);
        auVar38._8_4_ = -(uint)(0.9995 < fVar248);
        auVar38._12_4_ = -(uint)(0.9995 < fVar252);
        auVar114 = blendvps(auVar270,auVar216,auVar38);
        local_238._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar2->l).vx.field_0,0);
        auVar217._0_4_ = fVar202 * fVar228 - fVar72 * fVar237 * fVar275;
        auVar217._4_4_ = fVar202 * fVar229 - fVar73 * fVar240 * fVar278;
        auVar217._8_4_ = fVar202 * fVar230 - fVar75 * fVar250 * fVar281;
        auVar217._12_4_ = fVar202 * fVar231 - fVar94 * fVar264 * fVar191;
        auVar69._0_4_ = fVar58 * fVar162;
        auVar69._4_4_ = fVar28 * fVar189;
        auVar69._8_4_ = fVar54 * fVar190;
        auVar69._12_4_ = fVar57 * fVar192;
        auVar232 = blendvps(auVar217,auVar69,auVar38);
        auVar226._0_4_ = fVar108 * fVar228 - fVar95 * fVar237 * fVar275;
        auVar226._4_4_ = fVar108 * fVar229 - fVar96 * fVar240 * fVar278;
        auVar226._8_4_ = fVar108 * fVar230 - fVar106 * fVar250 * fVar281;
        auVar226._12_4_ = fVar108 * fVar231 - fVar107 * fVar264 * fVar191;
        auVar195._0_4_ = fVar200 * fVar162;
        auVar195._4_4_ = fVar201 * fVar189;
        auVar195._8_4_ = fVar203 * fVar190;
        auVar195._12_4_ = fVar214 * fVar192;
        auVar111 = blendvps(auVar226,auVar195,auVar38);
        auVar234._0_4_ = fVar228 * fVar224 - fVar237 * (float)local_88._0_4_ * fVar275;
        auVar234._4_4_ = fVar229 * fVar224 - fVar240 * (float)local_88._4_4_ * fVar278;
        auVar234._8_4_ = fVar230 * fVar224 - fVar250 * fStack_80 * fVar281;
        auVar234._12_4_ = fVar231 * fVar224 - fVar264 * fStack_7c * fVar191;
        auVar208._0_4_ = fVar162 * fVar284;
        auVar208._4_4_ = fVar189 * fVar289;
        auVar208._8_4_ = fVar190 * fVar291;
        auVar208._12_4_ = fVar192 * fVar294;
        auVar99 = blendvps(auVar234,auVar208,auVar38);
        local_168 = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,0);
        fVar28 = 1.0 - fVar109;
        fVar108 = 1.0 - fVar121;
        fVar224 = 1.0 - fVar122;
        fVar54 = 1.0 - fVar123;
        fVar202 = (float)local_238._0_4_ * fVar224;
        fVar58 = (float)local_238._0_4_ * fVar54;
        local_238._4_4_ = (float)local_238._0_4_ * fVar108 + local_168 * fVar121;
        local_238._0_4_ = (float)local_238._0_4_ * fVar28 + local_168 * fVar109;
        uStack_230._0_4_ = fVar202 + local_168 * fVar122;
        uStack_230._4_4_ = fVar58 + local_168 * fVar123;
        local_108._4_4_ = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,4);
        local_218._4_4_ = fVar74 * fVar108 + (float)local_108._4_4_ * fVar121;
        local_218._0_4_ = fVar74 * fVar28 + (float)local_108._4_4_ * fVar109;
        uStack_210._0_4_ = fVar74 * fVar224 + (float)local_108._4_4_ * fVar122;
        uStack_210._4_4_ = fVar74 * fVar54 + (float)local_108._4_4_ * fVar123;
        fStack_f0 = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,8);
        local_228._4_4_ = fVar97 * fVar108 + fStack_f0 * fVar121;
        local_228._0_4_ = fVar97 * fVar28 + fStack_f0 * fVar109;
        uStack_220._0_4_ = fVar97 * fVar224 + fStack_f0 * fVar122;
        uStack_220._4_4_ = fVar97 * fVar54 + fStack_f0 * fVar123;
        local_188._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,0);
        fVar74 = (float)local_188._0_4_ * fVar224;
        fVar97 = (float)local_188._0_4_ * fVar54;
        local_188._4_4_ = (float)local_188._0_4_ * fVar108 + local_68 * fVar121;
        local_188._0_4_ = (float)local_188._0_4_ * fVar28 + local_68 * fVar109;
        fStack_180 = fVar74 + local_68 * fVar122;
        fStack_17c = fVar97 + local_68 * fVar123;
        fStack_154 = SUB124(*(undefined1 (*) [12])&pVVar6->field_0,4);
        local_208._4_4_ = fVar48 * fVar108 + fStack_154 * fVar121;
        local_208._0_4_ = fVar48 * fVar28 + fStack_154 * fVar109;
        fStack_200 = fVar48 * fVar224 + fStack_154 * fVar122;
        fStack_1fc = fVar48 * fVar54 + fStack_154 * fVar123;
        fStack_130 = SUB124(*(undefined1 (*) [12])&pVVar6->field_0,8);
        local_268._4_4_ = fVar51 * fVar108 + fStack_130 * fVar121;
        local_268._0_4_ = fVar51 * fVar28 + fStack_130 * fVar109;
        uStack_260._0_4_ = fVar51 * fVar224 + fStack_130 * fVar122;
        uStack_260._4_4_ = fVar51 * fVar54 + fStack_130 * fVar123;
        local_258._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,0);
        local_148 = SUB124(*(undefined1 (*) [12])&pVVar8->field_0,0);
        fVar74 = (float)local_258._0_4_ * fVar224;
        fVar97 = (float)local_258._0_4_ * fVar54;
        local_258._4_4_ = (float)local_258._0_4_ * fVar108 + local_148 * fVar121;
        local_258._0_4_ = (float)local_258._0_4_ * fVar28 + local_148 * fVar109;
        uStack_250._0_4_ = fVar74 + local_148 * fVar122;
        uStack_250._4_4_ = fVar97 + local_148 * fVar123;
        local_128._4_4_ = SUB124(*(undefined1 (*) [12])&pVVar8->field_0,4);
        local_1b8._4_4_ = fVar220 * fVar108 + (float)local_128._4_4_ * fVar121;
        local_1b8._0_4_ = fVar220 * fVar28 + (float)local_128._4_4_ * fVar109;
        fStack_1b0 = fVar220 * fVar224 + (float)local_128._4_4_ * fVar122;
        fStack_1ac = fVar220 * fVar54 + (float)local_128._4_4_ * fVar123;
        fStack_110 = SUB124(*(undefined1 (*) [12])&pVVar8->field_0,8);
        local_1c8._4_4_ = fVar222 * fVar108 + fStack_110 * fVar121;
        local_1c8._0_4_ = fVar222 * fVar28 + fStack_110 * fVar109;
        fStack_1c0 = fVar222 * fVar224 + fStack_110 * fVar122;
        fStack_1bc = fVar222 * fVar54 + fStack_110 * fVar123;
        local_c8._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,0);
        local_d8._4_4_ = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,4);
        fStack_e0 = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,8);
        local_198._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,0);
        fVar74 = (float)local_198._0_4_ * fVar224;
        fVar97 = (float)local_198._0_4_ * fVar54;
        local_198._4_4_ = (float)local_198._0_4_ * fVar108 + (float)local_c8._0_4_ * fVar121;
        local_198._0_4_ = (float)local_198._0_4_ * fVar28 + (float)local_c8._0_4_ * fVar109;
        fStack_190 = fVar74 + (float)local_c8._0_4_ * fVar122;
        fStack_18c = fVar97 + (float)local_c8._0_4_ * fVar123;
        local_1a8._4_4_ = fVar204 * fVar108 + (float)local_d8._4_4_ * fVar121;
        local_1a8._0_4_ = fVar204 * fVar28 + (float)local_d8._4_4_ * fVar109;
        fStack_1a0 = fVar204 * fVar224 + (float)local_d8._4_4_ * fVar122;
        fStack_19c = fVar204 * fVar54 + (float)local_d8._4_4_ * fVar123;
        fStack_b0 = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,8);
        local_1d8._4_4_ = fVar108 * fStack_b0 + fStack_e0 * fVar121;
        local_1d8._0_4_ = fVar28 * fStack_b0 + fStack_e0 * fVar109;
        fStack_1d0 = fVar224 * fStack_b0 + fStack_e0 * fVar122;
        fStack_1cc = fVar54 * fStack_b0 + fStack_e0 * fVar123;
        fVar121 = auVar232._0_4_;
        fVar123 = auVar232._4_4_;
        fVar97 = auVar232._8_4_;
        fVar204 = auVar232._12_4_;
        fVar190 = auVar111._0_4_;
        fVar191 = auVar111._4_4_;
        fVar192 = auVar111._8_4_;
        fVar200 = auVar111._12_4_;
        local_1f8._0_4_ = auVar114._0_4_;
        local_1f8._4_4_ = auVar114._4_4_;
        fStack_1f0 = auVar114._8_4_;
        fStack_1ec = auVar114._12_4_;
        fVar109 = auVar99._0_4_;
        fVar122 = auVar99._4_4_;
        fVar74 = auVar99._8_4_;
        fVar202 = auVar99._12_4_;
        fVar108 = fVar121 * fVar190 + (float)local_1f8._0_4_ * fVar109;
        fVar220 = fVar123 * fVar191 + (float)local_1f8._4_4_ * fVar122;
        fVar222 = fVar97 * fVar192 + fStack_1f0 * fVar74;
        fVar224 = fVar204 * fVar200 + fStack_1ec * fVar202;
        fVar229 = fVar121 * fVar190 - (float)local_1f8._0_4_ * fVar109;
        fVar230 = fVar123 * fVar191 - (float)local_1f8._4_4_ * fVar122;
        fVar231 = fVar97 * fVar192 - fStack_1f0 * fVar74;
        fVar236 = fVar204 * fVar200 - fStack_1ec * fVar202;
        fVar58 = (float)local_1f8._0_4_ * (float)local_1f8._0_4_ - fVar121 * fVar121;
        fVar28 = (float)local_1f8._4_4_ * (float)local_1f8._4_4_ - fVar123 * fVar123;
        fVar48 = fStack_1f0 * fStack_1f0 - fVar97 * fVar97;
        fVar51 = fStack_1ec * fStack_1ec - fVar204 * fVar204;
        fVar75 = fVar121 * fVar109 - (float)local_1f8._0_4_ * fVar190;
        fVar94 = fVar123 * fVar122 - (float)local_1f8._4_4_ * fVar191;
        fVar95 = fVar97 * fVar74 - fStack_1f0 * fVar192;
        fVar96 = fVar204 * fVar202 - fStack_1ec * fVar200;
        fVar54 = (float)local_1f8._0_4_ * fVar190 + fVar121 * fVar109;
        fVar57 = (float)local_1f8._4_4_ * fVar191 + fVar123 * fVar122;
        fVar72 = fStack_1f0 * fVar192 + fVar97 * fVar74;
        fVar73 = fStack_1ec * fVar200 + fVar204 * fVar202;
        fVar201 = fVar109 * fVar190 + fVar121 * (float)local_1f8._0_4_;
        fVar214 = fVar122 * fVar191 + fVar123 * (float)local_1f8._4_4_;
        fVar221 = fVar74 * fVar192 + fVar97 * fStack_1f0;
        fVar225 = fVar202 * fVar200 + fVar204 * fStack_1ec;
        fVar106 = fVar109 * fVar190 - fVar121 * (float)local_1f8._0_4_;
        fVar107 = fVar122 * fVar191 - fVar123 * (float)local_1f8._4_4_;
        fVar162 = fVar74 * fVar192 - fVar97 * fStack_1f0;
        fVar189 = fVar202 * fVar200 - fVar204 * fStack_1ec;
        fVar190 = fVar190 * fVar190;
        fVar191 = fVar191 * fVar191;
        fVar192 = fVar192 * fVar192;
        fVar200 = fVar200 * fVar200;
        fVar109 = fVar109 * fVar109;
        fVar122 = fVar122 * fVar122;
        fVar74 = fVar74 * fVar74;
        fVar202 = fVar202 * fVar202;
        fVar203 = (((float)local_1f8._0_4_ * (float)local_1f8._0_4_ + fVar121 * fVar121) - fVar190)
                  - fVar109;
        fVar219 = (((float)local_1f8._4_4_ * (float)local_1f8._4_4_ + fVar123 * fVar123) - fVar191)
                  - fVar122;
        fVar223 = ((fStack_1f0 * fStack_1f0 + fVar97 * fVar97) - fVar192) - fVar74;
        fVar228 = ((fStack_1ec * fStack_1ec + fVar204 * fVar204) - fVar200) - fVar202;
        fVar121 = (fVar190 + fVar58) - fVar109;
        fVar123 = (fVar191 + fVar28) - fVar122;
        fVar97 = (fVar192 + fVar48) - fVar74;
        fVar204 = (fVar200 + fVar51) - fVar202;
        fVar109 = (fVar58 - fVar190) + fVar109;
        fVar122 = (fVar28 - fVar191) + fVar122;
        fVar74 = (fVar48 - fVar192) + fVar74;
        fVar202 = (fVar51 - fVar200) + fVar202;
      }
      else {
        while (uVar24 = movmskps((int)lVar25,auVar232), uVar24 != 0) {
          lVar25 = 0;
          if ((uVar24 & 0xff) != 0) {
            for (; ((uVar24 & 0xff) >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          iVar27 = *(int *)((long)&local_a8 + (long)(int)lVar25 * 4);
          lVar26 = (long)iVar27;
          auVar40._0_4_ = -(uint)(iVar27 == iVar239);
          auVar40._4_4_ = -(uint)(iVar27 == iVar247);
          auVar40._8_4_ = -(uint)(iVar27 == iVar249);
          auVar40._12_4_ = -(uint)(iVar27 == iVar251);
          auVar40 = auVar40 & auVar232;
          pAVar11 = pIVar9->local2world;
          lVar25 = lVar26 * 0x40;
          pAVar2 = pAVar11 + lVar26;
          uVar13 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar15 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          uVar16 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 0xc);
          auVar165._4_4_ = uVar13;
          auVar165._0_4_ = uVar13;
          auVar165._8_4_ = uVar13;
          auVar165._12_4_ = uVar13;
          _local_238 = blendvps(_local_238,auVar165,auVar40);
          auVar166._4_4_ = uVar14;
          auVar166._0_4_ = uVar14;
          auVar166._8_4_ = uVar14;
          auVar166._12_4_ = uVar14;
          _local_218 = blendvps(_local_218,auVar166,auVar40);
          auVar167._4_4_ = uVar15;
          auVar167._0_4_ = uVar15;
          auVar167._8_4_ = uVar15;
          auVar167._12_4_ = uVar15;
          _local_228 = blendvps(_local_228,auVar167,auVar40);
          auVar141._4_4_ = uVar16;
          auVar141._0_4_ = uVar16;
          auVar141._8_4_ = uVar16;
          auVar141._12_4_ = uVar16;
          in_XMM15 = blendvps(in_XMM15,auVar141,auVar40);
          pVVar3 = &pAVar11[lVar26].l.vy;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar168._4_4_ = uVar13;
          auVar168._0_4_ = uVar13;
          auVar168._8_4_ = uVar13;
          auVar168._12_4_ = uVar13;
          _local_188 = blendvps(_local_188,auVar168,auVar40);
          auVar169._4_4_ = uVar14;
          auVar169._0_4_ = uVar14;
          auVar169._8_4_ = uVar14;
          auVar169._12_4_ = uVar14;
          _local_208 = blendvps(_local_208,auVar169,auVar40);
          auVar170._4_4_ = uVar15;
          auVar170._0_4_ = uVar15;
          auVar170._8_4_ = uVar15;
          auVar170._12_4_ = uVar15;
          _local_268 = blendvps(_local_268,auVar170,auVar40);
          auVar142._4_4_ = uVar16;
          auVar142._0_4_ = uVar16;
          auVar142._8_4_ = uVar16;
          auVar142._12_4_ = uVar16;
          in_XMM13 = blendvps(in_XMM13,auVar142,auVar40);
          pVVar3 = &pAVar11[lVar26].l.vz;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar171._4_4_ = uVar13;
          auVar171._0_4_ = uVar13;
          auVar171._8_4_ = uVar13;
          auVar171._12_4_ = uVar13;
          _local_258 = blendvps(_local_258,auVar171,auVar40);
          auVar172._4_4_ = uVar14;
          auVar172._0_4_ = uVar14;
          auVar172._8_4_ = uVar14;
          auVar172._12_4_ = uVar14;
          _local_1b8 = blendvps(_local_1b8,auVar172,auVar40);
          auVar173._4_4_ = uVar15;
          auVar173._0_4_ = uVar15;
          auVar173._8_4_ = uVar15;
          auVar173._12_4_ = uVar15;
          _local_1c8 = blendvps(_local_1c8,auVar173,auVar40);
          auVar143._4_4_ = uVar16;
          auVar143._0_4_ = uVar16;
          auVar143._8_4_ = uVar16;
          auVar143._12_4_ = uVar16;
          in_XMM12 = blendvps(in_XMM12,auVar143,auVar40);
          pVVar3 = &pAVar11[lVar26].p;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar174._4_4_ = uVar13;
          auVar174._0_4_ = uVar13;
          auVar174._8_4_ = uVar13;
          auVar174._12_4_ = uVar13;
          _local_198 = blendvps(_local_198,auVar174,auVar40);
          auVar175._4_4_ = uVar14;
          auVar175._0_4_ = uVar14;
          auVar175._8_4_ = uVar14;
          auVar175._12_4_ = uVar14;
          _local_1a8 = blendvps(_local_1a8,auVar175,auVar40);
          auVar176._4_4_ = uVar15;
          auVar176._0_4_ = uVar15;
          auVar176._8_4_ = uVar15;
          auVar176._12_4_ = uVar15;
          _local_b8 = blendvps(_local_b8,auVar176,auVar40);
          auVar144._4_4_ = uVar16;
          auVar144._0_4_ = uVar16;
          auVar144._8_4_ = uVar16;
          auVar144._12_4_ = uVar16;
          auVar111 = blendvps(auVar111,auVar144,auVar40);
          pAVar2 = pAVar11 + lVar26 + 1;
          uVar13 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar15 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          uVar16 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 0xc);
          auVar177._4_4_ = uVar13;
          auVar177._0_4_ = uVar13;
          auVar177._8_4_ = uVar13;
          auVar177._12_4_ = uVar13;
          auVar99 = blendvps(auVar99,auVar177,auVar40);
          auVar178._4_4_ = uVar14;
          auVar178._0_4_ = uVar14;
          auVar178._8_4_ = uVar14;
          auVar178._12_4_ = uVar14;
          _local_128 = blendvps(_local_128,auVar178,auVar40);
          auVar179._4_4_ = uVar15;
          auVar179._0_4_ = uVar15;
          auVar179._8_4_ = uVar15;
          auVar179._12_4_ = uVar15;
          auVar145._4_4_ = uVar16;
          auVar145._0_4_ = uVar16;
          auVar145._8_4_ = uVar16;
          auVar145._12_4_ = uVar16;
          _local_118 = blendvps(_local_118,auVar179,auVar40);
          pVVar3 = &pAVar11[lVar26 + 1].l.vy;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          in_XMM4 = blendvps(in_XMM4,auVar145,auVar40);
          auVar146._4_4_ = uVar13;
          auVar146._0_4_ = uVar13;
          auVar146._8_4_ = uVar13;
          auVar146._12_4_ = uVar13;
          _local_108 = blendvps(_local_108,auVar146,auVar40);
          auVar147._4_4_ = uVar14;
          auVar147._0_4_ = uVar14;
          auVar147._8_4_ = uVar14;
          auVar147._12_4_ = uVar14;
          _local_f8 = blendvps(_local_f8,auVar147,auVar40);
          auVar148._4_4_ = uVar15;
          auVar148._0_4_ = uVar15;
          auVar148._8_4_ = uVar15;
          auVar148._12_4_ = uVar15;
          auVar180._4_4_ = uVar16;
          auVar180._0_4_ = uVar16;
          auVar180._8_4_ = uVar16;
          auVar180._12_4_ = uVar16;
          _local_e8 = blendvps(_local_e8,auVar148,auVar40);
          pVVar3 = &pAVar11[lVar26 + 1].l.vz;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          auVar114 = blendvps(auVar114,auVar180,auVar40);
          auVar181._4_4_ = uVar13;
          auVar181._0_4_ = uVar13;
          auVar181._8_4_ = uVar13;
          auVar181._12_4_ = uVar13;
          _local_d8 = blendvps(_local_d8,auVar181,auVar40);
          auVar182._4_4_ = uVar14;
          auVar182._0_4_ = uVar14;
          auVar182._8_4_ = uVar14;
          auVar182._12_4_ = uVar14;
          _local_1f8 = blendvps(_local_1f8,auVar182,auVar40);
          auVar183._4_4_ = uVar15;
          auVar183._0_4_ = uVar15;
          auVar183._8_4_ = uVar15;
          auVar183._12_4_ = uVar15;
          auVar149._4_4_ = uVar16;
          auVar149._0_4_ = uVar16;
          auVar149._8_4_ = uVar16;
          auVar149._12_4_ = uVar16;
          _local_c8 = blendvps(_local_c8,auVar183,auVar40);
          pVVar3 = &pAVar11[lVar26 + 1].p;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 0xc);
          in_XMM14 = blendvps(in_XMM14,auVar149,auVar40);
          auVar150._4_4_ = uVar13;
          auVar150._0_4_ = uVar13;
          auVar150._8_4_ = uVar13;
          auVar150._12_4_ = uVar13;
          _local_1d8 = blendvps(_local_1d8,auVar150,auVar40);
          auVar151._4_4_ = uVar14;
          auVar151._0_4_ = uVar14;
          auVar151._8_4_ = uVar14;
          auVar151._12_4_ = uVar14;
          _local_1e8 = blendvps(_local_1e8,auVar151,auVar40);
          auVar152._4_4_ = uVar15;
          auVar152._0_4_ = uVar15;
          auVar152._8_4_ = uVar15;
          auVar152._12_4_ = uVar15;
          _local_248 = blendvps(_local_248,auVar152,auVar40);
          auVar184._4_4_ = uVar16;
          auVar184._0_4_ = uVar16;
          auVar184._8_4_ = uVar16;
          auVar184._12_4_ = uVar16;
          auVar125 = blendvps(auVar125,auVar184,auVar40);
          auVar232 = auVar232 ^ auVar40;
        }
        fVar204 = auVar111._0_4_;
        fVar28 = auVar111._4_4_;
        fVar51 = auVar111._8_4_;
        fVar220 = auVar111._12_4_;
        fVar291 = in_XMM15._0_4_;
        fVar294 = in_XMM15._4_4_;
        fVar253 = in_XMM15._8_4_;
        fVar259 = in_XMM15._12_4_;
        fVar240 = in_XMM13._0_4_;
        fVar248 = in_XMM13._4_4_;
        fVar252 = in_XMM13._8_4_;
        fVar275 = in_XMM13._12_4_;
        fVar231 = in_XMM12._0_4_;
        fVar236 = in_XMM12._4_4_;
        fVar237 = in_XMM12._8_4_;
        fVar238 = in_XMM12._12_4_;
        auVar185._0_4_ =
             in_XMM14._0_4_ * fVar231 +
             auVar114._0_4_ * fVar240 + in_XMM4._0_4_ * fVar291 + auVar125._0_4_ * fVar204;
        auVar185._4_4_ =
             in_XMM14._4_4_ * fVar236 +
             auVar114._4_4_ * fVar248 + in_XMM4._4_4_ * fVar294 + auVar125._4_4_ * fVar28;
        auVar185._8_4_ =
             in_XMM14._8_4_ * fVar237 +
             auVar114._8_4_ * fVar252 + in_XMM4._8_4_ * fVar253 + auVar125._8_4_ * fVar51;
        auVar185._12_4_ =
             in_XMM14._12_4_ * fVar238 +
             auVar114._12_4_ * fVar275 + in_XMM4._12_4_ * fVar259 + auVar125._12_4_ * fVar220;
        uVar293 = CONCAT44(auVar185._4_4_,auVar185._0_4_);
        auVar41._4_4_ = -(uint)(auVar185._4_4_ < -auVar185._4_4_);
        auVar41._0_4_ = -(uint)(auVar185._0_4_ < -auVar185._0_4_);
        auVar41._8_4_ = -(uint)(auVar185._8_4_ < -auVar185._8_4_);
        auVar41._12_4_ = -(uint)(auVar185._12_4_ < -auVar185._12_4_);
        auVar153._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
        auVar153._8_4_ = -auVar125._8_4_;
        auVar153._12_4_ = -auVar125._12_4_;
        auVar111 = blendvps(auVar125,auVar153,auVar41);
        auVar154._0_8_ = in_XMM4._0_8_ ^ 0x8000000080000000;
        auVar154._8_4_ = -in_XMM4._8_4_;
        auVar154._12_4_ = -in_XMM4._12_4_;
        auVar125 = blendvps(in_XMM4,auVar154,auVar41);
        auVar155._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
        auVar155._8_4_ = -auVar114._8_4_;
        auVar155._12_4_ = -auVar114._12_4_;
        auVar232 = blendvps(auVar114,auVar155,auVar41);
        auVar156._0_8_ = in_XMM14._0_8_ ^ 0x8000000080000000;
        auVar156._8_4_ = -in_XMM14._8_4_;
        auVar156._12_4_ = -in_XMM14._12_4_;
        auVar206 = blendvps(in_XMM14,auVar156,auVar41);
        auVar272._8_4_ = -auVar185._8_4_;
        auVar272._0_8_ = uVar293 ^ 0x8000000080000000;
        auVar272._12_4_ = -auVar185._12_4_;
        _local_88 = maxps(auVar272,auVar185);
        fVar58 = ABS(auVar185._0_4_);
        fVar48 = ABS(auVar185._4_4_);
        uVar293 = CONCAT44(auVar185._4_4_,auVar185._0_4_);
        auVar186._0_8_ = uVar293 & 0x7fffffff7fffffff;
        auVar186._8_4_ = ABS(auVar185._8_4_);
        auVar186._12_4_ = ABS(auVar185._12_4_);
        fVar73 = (float)DAT_01f46a60;
        fVar75 = DAT_01f46a60._4_4_;
        fVar94 = DAT_01f46a60._8_4_;
        fVar95 = DAT_01f46a60._12_4_;
        auVar157._0_4_ = fVar73 - fVar58;
        auVar157._4_4_ = fVar75 - fVar48;
        auVar157._8_4_ = fVar94 - auVar186._8_4_;
        auVar157._12_4_ = fVar95 - auVar186._12_4_;
        auVar114 = sqrtps(auVar157,auVar157);
        auVar42._0_4_ =
             1.5707964 -
             auVar114._0_4_ *
             (((((fVar58 * -0.0043095737 + 0.0192803) * fVar58 + -0.04489909) * fVar58 + 0.08785567)
               * fVar58 + -0.21450998) * fVar58 + 1.5707952);
        auVar42._4_4_ =
             1.5707964 -
             auVar114._4_4_ *
             (((((fVar48 * -0.0043095737 + 0.0192803) * fVar48 + -0.04489909) * fVar48 + 0.08785567)
               * fVar48 + -0.21450998) * fVar48 + 1.5707952);
        auVar42._8_4_ =
             1.5707964 -
             auVar114._8_4_ *
             (((((auVar186._8_4_ * -0.0043095737 + 0.0192803) * auVar186._8_4_ + -0.04489909) *
                auVar186._8_4_ + 0.08785567) * auVar186._8_4_ + -0.21450998) * auVar186._8_4_ +
             1.5707952);
        auVar42._12_4_ =
             1.5707964 -
             auVar114._12_4_ *
             (((((auVar186._12_4_ * -0.0043095737 + 0.0192803) * auVar186._12_4_ + -0.04489909) *
                auVar186._12_4_ + 0.08785567) * auVar186._12_4_ + -0.21450998) * auVar186._12_4_ +
             1.5707952);
        auVar114 = maxps(ZEXT816(0),auVar42);
        fVar289 = local_88._12_4_;
        fVar74 = local_88._0_4_;
        fVar97 = local_88._4_4_;
        fVar202 = local_88._8_4_;
        auVar43._4_4_ = -(uint)(fVar97 < 0.0);
        auVar43._0_4_ = -(uint)(fVar74 < 0.0);
        auVar43._8_4_ = -(uint)(fVar202 < 0.0);
        auVar43._12_4_ = -(uint)(fVar289 < 0.0);
        auVar158._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
        auVar158._8_4_ = auVar114._8_4_ ^ 0x80000000;
        auVar158._12_4_ = auVar114._12_4_ ^ 0x80000000;
        auVar114 = blendvps(auVar114,auVar158,auVar43);
        auVar159._0_4_ = 1.5707964 - auVar114._0_4_;
        auVar159._4_4_ = 1.5707964 - auVar114._4_4_;
        auVar159._8_4_ = 1.5707964 - auVar114._8_4_;
        auVar159._12_4_ = 1.5707964 - auVar114._12_4_;
        auVar44._4_4_ = -(uint)(fVar75 < fVar48);
        auVar44._0_4_ = -(uint)(fVar73 < fVar58);
        auVar44._8_4_ = -(uint)(fVar94 < auVar186._8_4_);
        auVar44._12_4_ = -(uint)(fVar95 < auVar186._12_4_);
        auVar114 = blendvps(auVar159,_DAT_01f4bc50,auVar44);
        fVar58 = auVar114._0_4_ * fVar109;
        fVar48 = auVar114._4_4_ * fVar121;
        fVar108 = auVar114._8_4_ * fVar122;
        fVar222 = auVar114._12_4_ * fVar123;
        auVar45._0_4_ = fVar58 * 0.63661975;
        auVar45._4_4_ = fVar48 * 0.63661975;
        auVar45._8_4_ = fVar108 * 0.63661975;
        auVar45._12_4_ = fVar222 * 0.63661975;
        auVar114 = roundps(auVar186,auVar45,1);
        auVar196._0_8_ = CONCAT44((int)auVar114._4_4_,(int)auVar114._0_4_);
        auVar196._8_4_ = (int)auVar114._8_4_;
        auVar196._12_4_ = (int)auVar114._12_4_;
        fVar58 = fVar58 - auVar114._0_4_ * 1.5707964;
        fVar48 = fVar48 - auVar114._4_4_ * 1.5707964;
        fVar108 = fVar108 - auVar114._8_4_ * 1.5707964;
        fVar222 = fVar222 - auVar114._12_4_ * 1.5707964;
        uVar293 = auVar196._8_8_ & 0x300000003;
        fVar224 = fVar58 * fVar58;
        fVar54 = fVar48 * fVar48;
        fVar57 = fVar108 * fVar108;
        fVar72 = fVar222 * fVar222;
        auVar197._0_8_ = auVar196._0_8_ & 0x100000001;
        auVar197._8_8_ = auVar196._8_8_ & 0x100000001;
        auVar187._0_4_ = -(uint)((int)auVar197._0_8_ == 0);
        iVar239 = (int)(auVar197._0_8_ >> 0x20);
        auVar187._4_4_ = -(uint)(iVar239 == 0);
        iVar247 = (int)(auVar197._8_8_ >> 0x20);
        auVar187._8_4_ = -(uint)((int)auVar197._8_8_ == 0);
        auVar187._12_4_ = -(uint)(iVar247 == 0);
        auVar227._4_4_ = -iVar239;
        auVar227._0_4_ = -(int)auVar197._0_8_;
        auVar227._8_4_ = -(int)auVar197._8_8_;
        auVar227._12_4_ = -iVar247;
        auVar273._0_8_ =
             CONCAT44((((((fVar54 * -2.5029328e-08 + 2.7600126e-06) * fVar54 + -0.00019842605) *
                         fVar54 + 0.008333348) * fVar54 + -0.16666667) * fVar54 + fVar75) * fVar48,
                      (((((fVar224 * -2.5029328e-08 + 2.7600126e-06) * fVar224 + -0.00019842605) *
                         fVar224 + 0.008333348) * fVar224 + -0.16666667) * fVar224 + fVar73) *
                      fVar58);
        auVar273._8_4_ =
             (((((fVar57 * -2.5029328e-08 + 2.7600126e-06) * fVar57 + -0.00019842605) * fVar57 +
               0.008333348) * fVar57 + -0.16666667) * fVar57 + fVar94) * fVar108;
        auVar273._12_4_ =
             (((((fVar72 * -2.5029328e-08 + 2.7600126e-06) * fVar72 + -0.00019842605) * fVar72 +
               0.008333348) * fVar72 + -0.16666667) * fVar72 + fVar95) * fVar222;
        auVar211._0_4_ =
             ((((fVar224 * -2.5963018e-07 + 2.4756235e-05) * fVar224 + -0.001388833) * fVar224 +
              0.04166664) * fVar224 + -0.5) * fVar224 + fVar73;
        auVar211._4_4_ =
             ((((fVar54 * -2.5963018e-07 + 2.4756235e-05) * fVar54 + -0.001388833) * fVar54 +
              0.04166664) * fVar54 + -0.5) * fVar54 + fVar75;
        auVar211._8_4_ =
             ((((fVar57 * -2.5963018e-07 + 2.4756235e-05) * fVar57 + -0.001388833) * fVar57 +
              0.04166664) * fVar57 + -0.5) * fVar57 + fVar94;
        auVar211._12_4_ =
             ((((fVar72 * -2.5963018e-07 + 2.4756235e-05) * fVar72 + -0.001388833) * fVar72 +
              0.04166664) * fVar72 + -0.5) * fVar72 + fVar95;
        auVar160._8_4_ = auVar273._8_4_;
        auVar160._0_8_ = auVar273._0_8_;
        auVar160._12_4_ = auVar273._12_4_;
        auVar114 = blendvps(auVar160,auVar211,auVar227);
        auVar242 = blendvps(auVar273,auVar211,auVar187);
        auVar268 = pmovsxbd(auVar197,0x1010101);
        iVar239 = (int)(auVar196._0_8_ & 0x300000003);
        uVar52 = auVar268._0_4_;
        auVar46._0_4_ = -(uint)((int)uVar52 < iVar239);
        iVar247 = (int)((auVar196._0_8_ & 0x300000003) >> 0x20);
        uVar53 = auVar268._4_4_;
        auVar46._4_4_ = -(uint)((int)uVar53 < iVar247);
        iVar249 = (int)uVar293;
        uVar55 = auVar268._8_4_;
        iVar251 = (int)(uVar293 >> 0x20);
        auVar46._8_4_ = -(uint)((int)uVar55 < iVar249);
        uVar56 = auVar268._12_4_;
        auVar46._12_4_ = -(uint)((int)uVar56 < iVar251);
        auVar212._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
        auVar212._8_4_ = auVar114._8_4_ ^ 0x80000000;
        auVar212._12_4_ = auVar114._12_4_ ^ 0x80000000;
        _local_78 = blendvps(auVar114,auVar212,auVar46);
        fVar162 = local_78._12_4_;
        uVar24 = iVar239 - 1;
        uVar29 = iVar247 - 1;
        uVar49 = iVar249 - 1;
        uVar50 = iVar251 - 1;
        auVar161._0_4_ =
             -(uint)(((uVar24 < uVar52) * uVar24 | (uVar24 >= uVar52) * uVar52) == uVar24);
        auVar161._4_4_ =
             -(uint)(((uVar29 < uVar53) * uVar29 | (uVar29 >= uVar53) * uVar53) == uVar29);
        auVar161._8_4_ =
             -(uint)(((uVar49 < uVar55) * uVar49 | (uVar49 >= uVar55) * uVar55) == uVar49);
        auVar161._12_4_ =
             -(uint)(((uVar50 < uVar56) * uVar50 | (uVar50 >= uVar56) * uVar56) == uVar50);
        auVar258._0_8_ = auVar242._0_8_ ^ 0x8000000080000000;
        auVar258._8_4_ = auVar242._8_4_ ^ 0x80000000;
        auVar258._12_4_ = auVar242._12_4_ ^ 0x80000000;
        auVar114 = blendvps(auVar242,auVar258,auVar161);
        fVar190 = auVar114._0_4_;
        fVar201 = auVar114._12_4_;
        fVar58 = fVar204 * fVar74 - auVar111._0_4_;
        fVar48 = fVar28 * fVar97 - auVar111._4_4_;
        fVar108 = fVar51 * fVar202 - auVar111._8_4_;
        fVar222 = fVar220 * fVar289 - auVar111._12_4_;
        fVar214 = fVar291 * fVar74 - auVar125._0_4_;
        fVar219 = fVar294 * fVar97 - auVar125._4_4_;
        fVar221 = fVar253 * fVar202 - auVar125._8_4_;
        fVar223 = fVar259 * fVar289 - auVar125._12_4_;
        fVar225 = fVar240 * fVar74 - auVar232._0_4_;
        fVar228 = fVar248 * fVar97 - auVar232._4_4_;
        fVar229 = fVar252 * fVar202 - auVar232._8_4_;
        fVar230 = fVar275 * fVar289 - auVar232._12_4_;
        local_168 = auVar206._0_4_;
        fStack_164 = auVar206._4_4_;
        fStack_160 = auVar206._8_4_;
        fStack_15c = auVar206._12_4_;
        local_68 = fVar231 * fVar74 - local_168;
        fStack_64 = fVar236 * fVar97 - fStack_164;
        fStack_60 = fVar237 * fVar202 - fStack_160;
        fStack_5c = fVar238 * fVar289 - fStack_15c;
        auVar198._0_4_ =
             local_68 * local_68 + fVar225 * fVar225 + fVar214 * fVar214 + fVar58 * fVar58;
        auVar198._4_4_ =
             fStack_64 * fStack_64 + fVar228 * fVar228 + fVar219 * fVar219 + fVar48 * fVar48;
        auVar198._8_4_ =
             fStack_60 * fStack_60 + fVar229 * fVar229 + fVar221 * fVar221 + fVar108 * fVar108;
        auVar198._12_4_ =
             fStack_5c * fStack_5c + fVar230 * fVar230 + fVar223 * fVar223 + fVar222 * fVar222;
        auVar268 = rsqrtps(_DAT_01f46a60,auVar198);
        fVar224 = auVar268._0_4_;
        fVar54 = auVar268._4_4_;
        fVar57 = auVar268._8_4_;
        fVar72 = auVar268._12_4_;
        fVar96 = fVar224 * 1.5 - fVar224 * fVar224 * auVar198._0_4_ * 0.5 * fVar224;
        fVar106 = fVar54 * 1.5 - fVar54 * fVar54 * auVar198._4_4_ * 0.5 * fVar54;
        fVar107 = fVar57 * 1.5 - fVar57 * fVar57 * auVar198._8_4_ * 0.5 * fVar57;
        fVar189 = fVar72 * 1.5 - fVar72 * fVar72 * auVar198._12_4_ * 0.5 * fVar72;
        fVar278 = local_78._0_4_;
        fVar281 = local_78._4_4_;
        fVar284 = local_78._8_4_;
        fVar250 = auVar114._4_4_;
        fVar264 = auVar114._8_4_;
        auVar246._0_4_ = fVar204 * fVar190 - fVar58 * fVar96 * fVar278;
        auVar246._4_4_ = fVar28 * fVar250 - fVar48 * fVar106 * fVar281;
        auVar246._8_4_ = fVar51 * fVar264 - fVar108 * fVar107 * fVar284;
        auVar246._12_4_ = fVar220 * fVar201 - fVar222 * fVar189 * fVar162;
        fVar204 = (auVar111._0_4_ - fVar204) * fVar109 + fVar204;
        fVar28 = (auVar111._4_4_ - fVar28) * fVar121 + fVar28;
        fVar51 = (auVar111._8_4_ - fVar51) * fVar122 + fVar51;
        fVar220 = (auVar111._12_4_ - fVar220) * fVar123 + fVar220;
        fVar73 = (auVar125._0_4_ - fVar291) * fVar109 + fVar291;
        fVar75 = (auVar125._4_4_ - fVar294) * fVar121 + fVar294;
        fVar94 = (auVar125._8_4_ - fVar253) * fVar122 + fVar253;
        fVar95 = (auVar125._12_4_ - fVar259) * fVar123 + fVar259;
        fVar224 = (auVar232._0_4_ - fVar240) * fVar109 + fVar240;
        fVar54 = (auVar232._4_4_ - fVar248) * fVar121 + fVar248;
        fVar57 = (auVar232._8_4_ - fVar252) * fVar122 + fVar252;
        fVar72 = (auVar232._12_4_ - fVar275) * fVar123 + fVar275;
        auVar70._0_4_ = fVar224 * fVar224 + fVar73 * fVar73 + fVar204 * fVar204;
        auVar70._4_4_ = fVar54 * fVar54 + fVar75 * fVar75 + fVar28 * fVar28;
        auVar70._8_4_ = fVar57 * fVar57 + fVar94 * fVar94 + fVar51 * fVar51;
        auVar70._12_4_ = fVar72 * fVar72 + fVar95 * fVar95 + fVar220 * fVar220;
        fVar191 = (local_168 - fVar231) * fVar109 + fVar231;
        fVar192 = (fStack_164 - fVar236) * fVar121 + fVar236;
        fVar200 = (fStack_160 - fVar237) * fVar122 + fVar237;
        fVar203 = (fStack_15c - fVar238) * fVar123 + fVar238;
        auVar188._0_4_ = fVar191 * fVar191 + auVar70._0_4_;
        auVar188._4_4_ = fVar192 * fVar192 + auVar70._4_4_;
        auVar188._8_4_ = fVar200 * fVar200 + auVar70._8_4_;
        auVar188._12_4_ = fVar203 * fVar203 + auVar70._12_4_;
        auVar232 = rsqrtps(auVar70,auVar188);
        fVar58 = auVar232._0_4_;
        fVar48 = auVar232._4_4_;
        fVar108 = auVar232._8_4_;
        fVar222 = auVar232._12_4_;
        fVar58 = fVar58 * 1.5 - fVar58 * fVar58 * auVar188._0_4_ * 0.5 * fVar58;
        fVar48 = fVar48 * 1.5 - fVar48 * fVar48 * auVar188._4_4_ * 0.5 * fVar48;
        fVar108 = fVar108 * 1.5 - fVar108 * fVar108 * auVar188._8_4_ * 0.5 * fVar108;
        fVar222 = fVar222 * 1.5 - fVar222 * fVar222 * auVar188._12_4_ * 0.5 * fVar222;
        auVar105._0_4_ = fVar204 * fVar58;
        auVar105._4_4_ = fVar28 * fVar48;
        auVar105._8_4_ = fVar51 * fVar108;
        auVar105._12_4_ = fVar220 * fVar222;
        auVar47._4_4_ = -(uint)(0.9995 < fVar97);
        auVar47._0_4_ = -(uint)(0.9995 < fVar74);
        auVar47._8_4_ = -(uint)(0.9995 < fVar202);
        auVar47._12_4_ = -(uint)(0.9995 < fVar289);
        auVar114 = blendvps(auVar246,auVar105,auVar47);
        auVar71._0_4_ = fVar291 * fVar190 - fVar214 * fVar96 * fVar278;
        auVar71._4_4_ = fVar294 * fVar250 - fVar219 * fVar106 * fVar281;
        auVar71._8_4_ = fVar253 * fVar264 - fVar221 * fVar107 * fVar284;
        auVar71._12_4_ = fVar259 * fVar201 - fVar223 * fVar189 * fVar162;
        auVar120._0_4_ = fVar73 * fVar58;
        auVar120._4_4_ = fVar75 * fVar48;
        auVar120._8_4_ = fVar94 * fVar108;
        auVar120._12_4_ = fVar95 * fVar222;
        auVar232 = blendvps(auVar71,auVar120,auVar47);
        auVar213._0_4_ = fVar240 * fVar190 - fVar225 * fVar96 * fVar278;
        auVar213._4_4_ = fVar248 * fVar250 - fVar228 * fVar106 * fVar281;
        auVar213._8_4_ = fVar252 * fVar264 - fVar229 * fVar107 * fVar284;
        auVar213._12_4_ = fVar275 * fVar201 - fVar230 * fVar189 * fVar162;
        auVar93._0_4_ = fVar224 * fVar58;
        auVar93._4_4_ = fVar54 * fVar48;
        auVar93._8_4_ = fVar57 * fVar108;
        auVar93._12_4_ = fVar72 * fVar222;
        auVar111 = blendvps(auVar213,auVar93,auVar47);
        auVar274._0_4_ = fVar190 * fVar231 - fVar96 * local_68 * fVar278;
        auVar274._4_4_ = fVar250 * fVar236 - fVar106 * fStack_64 * fVar281;
        auVar274._8_4_ = fVar264 * fVar237 - fVar107 * fStack_60 * fVar284;
        auVar274._12_4_ = fVar201 * fVar238 - fVar189 * fStack_5c * fVar162;
        auVar199._0_4_ = fVar58 * fVar191;
        auVar199._4_4_ = fVar48 * fVar192;
        auVar199._8_4_ = fVar108 * fVar200;
        auVar199._12_4_ = fVar222 * fVar203;
        auVar125 = blendvps(auVar274,auVar199,auVar47);
        fVar202 = auVar125._12_4_;
        fVar74 = 1.0 - fVar109;
        fVar97 = 1.0 - fVar121;
        fVar204 = 1.0 - fVar122;
        fVar58 = 1.0 - fVar123;
        local_238._4_4_ = (float)local_238._4_4_ * fVar97 + auVar99._4_4_ * fVar121;
        local_238._0_4_ = (float)local_238._0_4_ * fVar74 + auVar99._0_4_ * fVar109;
        uStack_230._0_4_ = (float)uStack_230 * fVar204 + auVar99._8_4_ * fVar122;
        uStack_230._4_4_ = uStack_230._4_4_ * fVar58 + auVar99._12_4_ * fVar123;
        local_218._4_4_ = (float)local_218._4_4_ * fVar97 + (float)local_128._4_4_ * fVar121;
        local_218._0_4_ = (float)local_218._0_4_ * fVar74 + (float)local_128._0_4_ * fVar109;
        uStack_210._0_4_ = (float)uStack_210 * fVar204 + fStack_120 * fVar122;
        uStack_210._4_4_ = uStack_210._4_4_ * fVar58 + fStack_11c * fVar123;
        local_228._4_4_ = (float)local_228._4_4_ * fVar97 + (float)local_118._4_4_ * fVar121;
        local_228._0_4_ = (float)local_228._0_4_ * fVar74 + (float)local_118._0_4_ * fVar109;
        uStack_220._0_4_ = (float)uStack_220 * fVar204 + fStack_110 * fVar122;
        uStack_220._4_4_ = uStack_220._4_4_ * fVar58 + fStack_10c * fVar123;
        local_188._4_4_ = (float)local_188._4_4_ * fVar97 + (float)local_108._4_4_ * fVar121;
        local_188._0_4_ = (float)local_188._0_4_ * fVar74 + (float)local_108._0_4_ * fVar109;
        fStack_180 = fStack_180 * fVar204 + fStack_100 * fVar122;
        fStack_17c = fStack_17c * fVar58 + fStack_fc * fVar123;
        local_208._4_4_ = (float)local_208._4_4_ * fVar97 + (float)local_f8._4_4_ * fVar121;
        local_208._0_4_ = (float)local_208._0_4_ * fVar74 + (float)local_f8._0_4_ * fVar109;
        fStack_200 = fStack_200 * fVar204 + fStack_f0 * fVar122;
        fStack_1fc = fStack_1fc * fVar58 + fStack_ec * fVar123;
        local_268._4_4_ = (float)local_268._4_4_ * fVar97 + (float)local_e8._4_4_ * fVar121;
        local_268._0_4_ = (float)local_268._0_4_ * fVar74 + (float)local_e8._0_4_ * fVar109;
        uStack_260._0_4_ = (float)uStack_260 * fVar204 + fStack_e0 * fVar122;
        uStack_260._4_4_ = uStack_260._4_4_ * fVar58 + fStack_dc * fVar123;
        local_258._4_4_ = (float)local_258._4_4_ * fVar97 + (float)local_d8._4_4_ * fVar121;
        local_258._0_4_ = (float)local_258._0_4_ * fVar74 + (float)local_d8._0_4_ * fVar109;
        uStack_250._0_4_ = (float)uStack_250 * fVar204 + fStack_d0 * fVar122;
        uStack_250._4_4_ = uStack_250._4_4_ * fVar58 + fStack_cc * fVar123;
        local_1b8._4_4_ = (float)local_1b8._4_4_ * fVar97 + (float)local_1f8._4_4_ * fVar121;
        local_1b8._0_4_ = (float)local_1b8._0_4_ * fVar74 + (float)local_1f8._0_4_ * fVar109;
        fStack_1b0 = fStack_1b0 * fVar204 + fStack_1f0 * fVar122;
        fStack_1ac = fStack_1ac * fVar58 + fStack_1ec * fVar123;
        local_1c8._4_4_ = (float)local_1c8._4_4_ * fVar97 + (float)local_c8._4_4_ * fVar121;
        local_1c8._0_4_ = (float)local_1c8._0_4_ * fVar74 + (float)local_c8._0_4_ * fVar109;
        fStack_1c0 = fStack_1c0 * fVar204 + fStack_c0 * fVar122;
        fStack_1bc = fStack_1bc * fVar58 + fStack_bc * fVar123;
        local_198._4_4_ = (float)local_198._4_4_ * fVar97 + (float)local_1d8._4_4_ * fVar121;
        local_198._0_4_ = (float)local_198._0_4_ * fVar74 + (float)local_1d8._0_4_ * fVar109;
        fStack_190 = fStack_190 * fVar204 + fStack_1d0 * fVar122;
        fStack_18c = fStack_18c * fVar58 + fStack_1cc * fVar123;
        local_1a8._4_4_ = (float)local_1a8._4_4_ * fVar97 + (float)local_1e8._4_4_ * fVar121;
        local_1a8._0_4_ = (float)local_1a8._0_4_ * fVar74 + (float)local_1e8._0_4_ * fVar109;
        fStack_1a0 = fStack_1a0 * fVar204 + fStack_1e0 * fVar122;
        fStack_19c = fStack_19c * fVar58 + fStack_1dc * fVar123;
        local_1d8._4_4_ = fVar97 * (float)local_b8._4_4_ + (float)local_248._4_4_ * fVar121;
        local_1d8._0_4_ = fVar74 * (float)local_b8._0_4_ + (float)local_248._0_4_ * fVar109;
        fStack_1d0 = fVar204 * fStack_b0 + (float)uStack_240 * fVar122;
        fStack_1cc = fVar58 * fStack_ac + uStack_240._4_4_ * fVar123;
        fVar121 = auVar232._0_4_;
        fVar123 = auVar232._4_4_;
        fVar204 = auVar232._12_4_;
        fVar203 = auVar114._0_4_;
        fVar219 = auVar114._4_4_;
        fVar223 = auVar114._8_4_;
        fVar228 = auVar114._12_4_;
        fVar97 = auVar232._8_4_;
        fVar106 = auVar111._0_4_;
        fVar107 = auVar111._4_4_;
        fVar162 = auVar111._8_4_;
        fVar189 = auVar111._12_4_;
        fVar109 = auVar125._0_4_;
        fVar122 = auVar125._4_4_;
        fVar74 = auVar125._8_4_;
        fVar108 = fVar121 * fVar106 + fVar203 * fVar109;
        fVar220 = fVar123 * fVar107 + fVar219 * fVar122;
        fVar222 = fVar97 * fVar162 + fVar223 * fVar74;
        fVar224 = fVar204 * fVar189 + fVar228 * fVar202;
        fVar229 = fVar121 * fVar106 - fVar203 * fVar109;
        fVar230 = fVar123 * fVar107 - fVar219 * fVar122;
        fVar231 = fVar97 * fVar162 - fVar223 * fVar74;
        fVar236 = fVar204 * fVar189 - fVar228 * fVar202;
        fVar190 = fVar106 * fVar106;
        fVar191 = fVar107 * fVar107;
        fVar192 = fVar162 * fVar162;
        fVar200 = fVar189 * fVar189;
        fVar58 = fVar203 * fVar203 - fVar121 * fVar121;
        fVar28 = fVar219 * fVar219 - fVar123 * fVar123;
        fVar48 = fVar223 * fVar223 - fVar97 * fVar97;
        fVar51 = fVar228 * fVar228 - fVar204 * fVar204;
        fVar75 = fVar121 * fVar109 - fVar203 * fVar106;
        fVar94 = fVar123 * fVar122 - fVar219 * fVar107;
        fVar95 = fVar97 * fVar74 - fVar223 * fVar162;
        fVar96 = fVar204 * fVar202 - fVar228 * fVar189;
        fVar54 = fVar203 * fVar106 + fVar121 * fVar109;
        fVar57 = fVar219 * fVar107 + fVar123 * fVar122;
        fVar72 = fVar223 * fVar162 + fVar97 * fVar74;
        fVar73 = fVar228 * fVar189 + fVar204 * fVar202;
        fVar201 = fVar109 * fVar106 + fVar121 * fVar203;
        fVar214 = fVar122 * fVar107 + fVar123 * fVar219;
        fVar221 = fVar74 * fVar162 + fVar97 * fVar223;
        fVar225 = fVar202 * fVar189 + fVar204 * fVar228;
        fVar106 = fVar109 * fVar106 - fVar121 * fVar203;
        fVar107 = fVar122 * fVar107 - fVar123 * fVar219;
        fVar162 = fVar74 * fVar162 - fVar97 * fVar223;
        fVar189 = fVar202 * fVar189 - fVar204 * fVar228;
        fVar109 = fVar109 * fVar109;
        fVar122 = fVar122 * fVar122;
        fVar74 = fVar74 * fVar74;
        fVar202 = fVar202 * fVar202;
        fVar203 = ((fVar203 * fVar203 + fVar121 * fVar121) - fVar190) - fVar109;
        fVar219 = ((fVar219 * fVar219 + fVar123 * fVar123) - fVar191) - fVar122;
        fVar223 = ((fVar223 * fVar223 + fVar97 * fVar97) - fVar192) - fVar74;
        fVar228 = ((fVar228 * fVar228 + fVar204 * fVar204) - fVar200) - fVar202;
        fVar121 = (fVar190 + fVar58) - fVar109;
        fVar123 = (fVar191 + fVar28) - fVar122;
        fVar97 = (fVar192 + fVar48) - fVar74;
        fVar204 = (fVar200 + fVar51) - fVar202;
        fVar109 = (fVar58 - fVar190) + fVar109;
        fVar122 = (fVar28 - fVar191) + fVar122;
        fVar74 = (fVar48 - fVar192) + fVar74;
        fVar202 = (fVar51 - fVar200) + fVar202;
      }
      fVar58 = (fVar75 + fVar75) * 0.0;
      fVar28 = (fVar94 + fVar94) * 0.0;
      fVar48 = (fVar95 + fVar95) * 0.0;
      fVar51 = (fVar96 + fVar96) * 0.0;
      fVar190 = (fVar108 + fVar108) * 0.0;
      fVar191 = (fVar220 + fVar220) * 0.0;
      fVar192 = (fVar222 + fVar222) * 0.0;
      fVar200 = (fVar224 + fVar224) * 0.0;
      fVar237 = fVar190 + fVar58 + fVar203;
      fVar238 = fVar191 + fVar28 + fVar219;
      fVar240 = fVar192 + fVar48 + fVar223;
      fVar248 = fVar200 + fVar51 + fVar228;
      fVar58 = fVar58 + fVar108 + fVar108 + fVar203 * 0.0;
      fVar28 = fVar28 + fVar220 + fVar220 + fVar219 * 0.0;
      fVar48 = fVar48 + fVar222 + fVar222 + fVar223 * 0.0;
      fVar51 = fVar51 + fVar224 + fVar224 + fVar228 * 0.0;
      fVar265 = fVar203 * 0.0 + fVar75 + fVar75 + fVar190;
      fVar276 = fVar219 * 0.0 + fVar94 + fVar94 + fVar191;
      fVar279 = fVar223 * 0.0 + fVar95 + fVar95 + fVar192;
      fVar282 = fVar228 * 0.0 + fVar96 + fVar96 + fVar200;
      fVar108 = (fVar201 + fVar201) * 0.0;
      fVar220 = (fVar214 + fVar214) * 0.0;
      fVar222 = (fVar221 + fVar221) * 0.0;
      fVar224 = (fVar225 + fVar225) * 0.0;
      fVar203 = fVar108 + fVar121 * 0.0 + fVar229 + fVar229;
      fVar219 = fVar220 + fVar123 * 0.0 + fVar230 + fVar230;
      fVar223 = fVar222 + fVar97 * 0.0 + fVar231 + fVar231;
      fVar228 = fVar224 + fVar204 * 0.0 + fVar236 + fVar236;
      fVar253 = (fVar229 + fVar229) * 0.0;
      fVar259 = (fVar230 + fVar230) * 0.0;
      fVar260 = (fVar231 + fVar231) * 0.0;
      fVar262 = (fVar236 + fVar236) * 0.0;
      fVar229 = fVar121 + fVar108 + fVar253;
      fVar230 = fVar123 + fVar220 + fVar259;
      fVar231 = fVar97 + fVar222 + fVar260;
      fVar236 = fVar204 + fVar224 + fVar262;
      fVar253 = fVar253 + fVar121 * 0.0 + fVar201 + fVar201;
      fVar259 = fVar259 + fVar123 * 0.0 + fVar214 + fVar214;
      fVar260 = fVar260 + fVar97 * 0.0 + fVar221 + fVar221;
      fVar262 = fVar262 + fVar204 * 0.0 + fVar225 + fVar225;
      fVar121 = (fVar106 + fVar106) * 0.0;
      fVar123 = (fVar107 + fVar107) * 0.0;
      fVar97 = (fVar162 + fVar162) * 0.0;
      fVar204 = (fVar189 + fVar189) * 0.0;
      fVar285 = fVar121 + fVar109 * 0.0 + fVar54 + fVar54;
      fVar290 = fVar123 + fVar122 * 0.0 + fVar57 + fVar57;
      fVar292 = fVar97 + fVar74 * 0.0 + fVar72 + fVar72;
      fVar295 = fVar204 + fVar202 * 0.0 + fVar73 + fVar73;
      fVar190 = (fVar54 + fVar54) * 0.0;
      fVar191 = (fVar57 + fVar57) * 0.0;
      fVar192 = (fVar72 + fVar72) * 0.0;
      fVar200 = (fVar73 + fVar73) * 0.0;
      fVar201 = fVar109 * 0.0 + fVar106 + fVar106 + fVar190;
      fVar214 = fVar122 * 0.0 + fVar107 + fVar107 + fVar191;
      fVar261 = fVar74 * 0.0 + fVar162 + fVar162 + fVar192;
      fVar263 = fVar202 * 0.0 + fVar189 + fVar189 + fVar200;
      fVar190 = fVar190 + fVar121 + fVar109;
      fVar191 = fVar191 + fVar123 + fVar122;
      fVar192 = fVar192 + fVar97 + fVar74;
      fVar200 = fVar200 + fVar204 + fVar202;
      fVar221 = (float)local_238._0_4_ * fVar237 + fVar203 * 0.0 + fVar285 * 0.0;
      fVar225 = (float)local_238._4_4_ * fVar238 + fVar219 * 0.0 + fVar290 * 0.0;
      fVar250 = (float)uStack_230 * fVar240 + fVar223 * 0.0 + fVar292 * 0.0;
      fVar252 = uStack_230._4_4_ * fVar248 + fVar228 * 0.0 + fVar295 * 0.0;
      fVar284 = (float)local_238._0_4_ * fVar58 + fVar229 * 0.0 + fVar201 * 0.0;
      fVar289 = (float)local_238._4_4_ * fVar28 + fVar230 * 0.0 + fVar214 * 0.0;
      fVar291 = (float)uStack_230 * fVar48 + fVar231 * 0.0 + fVar261 * 0.0;
      fVar294 = uStack_230._4_4_ * fVar51 + fVar236 * 0.0 + fVar263 * 0.0;
      fVar109 = (float)local_238._0_4_ * fVar265 + fVar253 * 0.0 + fVar190 * 0.0;
      fVar123 = (float)local_238._4_4_ * fVar276 + fVar259 * 0.0 + fVar191 * 0.0;
      fVar202 = (float)uStack_230 * fVar279 + fVar260 * 0.0 + fVar192 * 0.0;
      fVar220 = uStack_230._4_4_ * fVar282 + fVar262 * 0.0 + fVar200 * 0.0;
      fVar121 = (float)local_188._0_4_ * fVar237 + (float)local_208._0_4_ * fVar203 + fVar285 * 0.0;
      fVar74 = (float)local_188._4_4_ * fVar238 + (float)local_208._4_4_ * fVar219 + fVar290 * 0.0;
      fVar204 = fStack_180 * fVar240 + fStack_200 * fVar223 + fVar292 * 0.0;
      fVar222 = fStack_17c * fVar248 + fStack_1fc * fVar228 + fVar295 * 0.0;
      fVar264 = (float)local_188._0_4_ * fVar58 + (float)local_208._0_4_ * fVar229 + fVar201 * 0.0;
      fVar275 = (float)local_188._4_4_ * fVar28 + (float)local_208._4_4_ * fVar230 + fVar214 * 0.0;
      fVar278 = fStack_180 * fVar48 + fStack_200 * fVar231 + fVar261 * 0.0;
      fVar281 = fStack_17c * fVar51 + fStack_1fc * fVar236 + fVar263 * 0.0;
      fVar75 = (float)local_188._0_4_ * fVar265 + (float)local_208._0_4_ * fVar253 + fVar190 * 0.0;
      fVar94 = (float)local_188._4_4_ * fVar276 + (float)local_208._4_4_ * fVar259 + fVar191 * 0.0;
      fVar95 = fStack_180 * fVar279 + fStack_200 * fVar260 + fVar192 * 0.0;
      fVar96 = fStack_17c * fVar282 + fStack_1fc * fVar262 + fVar200 * 0.0;
      fVar266 = (float)local_258._0_4_ * fVar237 +
                (float)local_1b8._0_4_ * fVar203 + (float)local_1c8._0_4_ * fVar285;
      fVar277 = (float)local_258._4_4_ * fVar238 +
                (float)local_1b8._4_4_ * fVar219 + (float)local_1c8._4_4_ * fVar290;
      fVar280 = (float)uStack_250 * fVar240 + fStack_1b0 * fVar223 + fStack_1c0 * fVar292;
      fVar283 = uStack_250._4_4_ * fVar248 + fStack_1ac * fVar228 + fStack_1bc * fVar295;
      fVar122 = (float)local_258._0_4_ * fVar58 +
                (float)local_1b8._0_4_ * fVar229 + (float)local_1c8._0_4_ * fVar201;
      fVar97 = (float)local_258._4_4_ * fVar28 +
               (float)local_1b8._4_4_ * fVar230 + (float)local_1c8._4_4_ * fVar214;
      fVar108 = (float)uStack_250 * fVar48 + fStack_1b0 * fVar231 + fStack_1c0 * fVar261;
      fVar224 = uStack_250._4_4_ * fVar51 + fStack_1ac * fVar236 + fStack_1bc * fVar263;
      fVar54 = (float)local_258._0_4_ * fVar265 +
               (float)local_1b8._0_4_ * fVar253 + (float)local_1c8._0_4_ * fVar190;
      fVar57 = (float)local_258._4_4_ * fVar276 +
               (float)local_1b8._4_4_ * fVar259 + (float)local_1c8._4_4_ * fVar191;
      fVar72 = (float)uStack_250 * fVar279 + fStack_1b0 * fVar260 + fStack_1c0 * fVar192;
      fVar73 = uStack_250._4_4_ * fVar282 + fStack_1ac * fVar262 + fStack_1bc * fVar200;
      fVar106 = fVar237 * (float)local_198._0_4_ +
                fVar203 * (float)local_1a8._0_4_ + fVar285 * (float)local_1d8._0_4_ +
                (float)local_218._0_4_ + 0.0;
      fVar107 = fVar238 * (float)local_198._4_4_ +
                fVar219 * (float)local_1a8._4_4_ + fVar290 * (float)local_1d8._4_4_ +
                (float)local_218._4_4_ + 0.0;
      fVar162 = fVar240 * fStack_190 + fVar223 * fStack_1a0 + fVar292 * fStack_1d0 +
                (float)uStack_210 + 0.0;
      fVar189 = fVar248 * fStack_18c + fVar228 * fStack_19c + fVar295 * fStack_1cc +
                uStack_210._4_4_ + 0.0;
      fVar201 = fVar58 * (float)local_198._0_4_ +
                fVar229 * (float)local_1a8._0_4_ + fVar201 * (float)local_1d8._0_4_ +
                (float)local_228._0_4_ + 0.0;
      fVar203 = fVar28 * (float)local_198._4_4_ +
                fVar230 * (float)local_1a8._4_4_ + fVar214 * (float)local_1d8._4_4_ +
                (float)local_228._4_4_ + 0.0;
      fVar214 = fVar48 * fStack_190 + fVar231 * fStack_1a0 + fVar261 * fStack_1d0 +
                (float)uStack_220 + 0.0;
      fVar219 = fVar51 * fStack_18c + fVar236 * fStack_19c + fVar263 * fStack_1cc +
                uStack_220._4_4_ + 0.0;
      fVar58 = fVar265 * (float)local_198._0_4_ +
               fVar253 * (float)local_1a8._0_4_ + fVar190 * (float)local_1d8._0_4_ +
               (float)local_268._0_4_ + 0.0;
      fVar28 = fVar276 * (float)local_198._4_4_ +
               fVar259 * (float)local_1a8._4_4_ + fVar191 * (float)local_1d8._4_4_ +
               (float)local_268._4_4_ + 0.0;
      fVar48 = fVar279 * fStack_190 + fVar260 * fStack_1a0 + fVar192 * fStack_1d0 +
               (float)uStack_260 + 0.0;
      fVar51 = fVar282 * fStack_18c + fVar262 * fStack_19c + fVar200 * fStack_1cc +
               uStack_260._4_4_ + 0.0;
      auVar80._0_4_ = fVar264 * fVar54 - fVar75 * fVar122;
      auVar80._4_4_ = fVar275 * fVar57 - fVar94 * fVar97;
      auVar80._8_4_ = fVar278 * fVar72 - fVar95 * fVar108;
      auVar80._12_4_ = fVar281 * fVar73 - fVar96 * fVar224;
      auVar118._0_4_ = fVar75 * fVar266 - fVar121 * fVar54;
      auVar118._4_4_ = fVar94 * fVar277 - fVar74 * fVar57;
      auVar118._8_4_ = fVar95 * fVar280 - fVar204 * fVar72;
      auVar118._12_4_ = fVar96 * fVar283 - fVar222 * fVar73;
      auVar126._0_4_ = fVar121 * fVar122 - fVar264 * fVar266;
      auVar126._4_4_ = fVar74 * fVar97 - fVar275 * fVar277;
      auVar126._8_4_ = fVar204 * fVar108 - fVar278 * fVar280;
      auVar126._12_4_ = fVar222 * fVar224 - fVar281 * fVar283;
      auVar209._0_4_ = fVar122 * fVar109 - fVar54 * fVar284;
      auVar209._4_4_ = fVar97 * fVar123 - fVar57 * fVar289;
      auVar209._8_4_ = fVar108 * fVar202 - fVar72 * fVar291;
      auVar209._12_4_ = fVar224 * fVar220 - fVar73 * fVar294;
      local_258._4_4_ = fVar57 * fVar225 - fVar277 * fVar123;
      local_258._0_4_ = fVar54 * fVar221 - fVar266 * fVar109;
      uStack_250._0_4_ = fVar72 * fVar250 - fVar280 * fVar202;
      uStack_250._4_4_ = fVar73 * fVar252 - fVar283 * fVar220;
      auVar287._0_4_ = fVar266 * fVar284 - fVar122 * fVar221;
      auVar287._4_4_ = fVar277 * fVar289 - fVar97 * fVar225;
      auVar287._8_4_ = fVar280 * fVar291 - fVar108 * fVar250;
      auVar287._12_4_ = fVar283 * fVar294 - fVar224 * fVar252;
      auVar256._0_4_ = fVar284 * fVar75 - fVar109 * fVar264;
      auVar256._4_4_ = fVar289 * fVar94 - fVar123 * fVar275;
      auVar256._8_4_ = fVar291 * fVar95 - fVar202 * fVar278;
      auVar256._12_4_ = fVar294 * fVar96 - fVar220 * fVar281;
      auVar244._0_4_ = fVar109 * fVar121 - fVar75 * fVar221;
      auVar244._4_4_ = fVar123 * fVar74 - fVar94 * fVar225;
      auVar244._8_4_ = fVar202 * fVar204 - fVar95 * fVar250;
      auVar244._12_4_ = fVar220 * fVar222 - fVar96 * fVar252;
      auVar103._4_4_ = fVar275 * fVar225 - fVar74 * fVar289;
      auVar103._0_4_ = fVar264 * fVar221 - fVar121 * fVar284;
      auVar103._8_4_ = fVar278 * fVar250 - fVar204 * fVar291;
      auVar103._12_4_ = fVar281 * fVar252 - fVar222 * fVar294;
      auVar218._0_4_ = fVar221 * auVar80._0_4_ + fVar284 * auVar118._0_4_ + fVar109 * auVar126._0_4_
      ;
      auVar218._4_4_ = fVar225 * auVar80._4_4_ + fVar289 * auVar118._4_4_ + fVar123 * auVar126._4_4_
      ;
      auVar218._8_4_ = fVar250 * auVar80._8_4_ + fVar291 * auVar118._8_4_ + fVar202 * auVar126._8_4_
      ;
      auVar218._12_4_ =
           fVar252 * auVar80._12_4_ + fVar294 * auVar118._12_4_ + fVar220 * auVar126._12_4_;
      auVar111 = divps(auVar80,auVar218);
      auVar206 = divps(auVar209,auVar218);
      auVar255 = divps(auVar256,auVar218);
      auVar114 = divps(auVar118,auVar218);
      auVar268 = divps(_local_258,auVar218);
      auVar242 = divps(auVar244,auVar218);
      auVar125 = divps(auVar126,auVar218);
      auVar232 = divps(auVar287,auVar218);
      auVar99 = divps(auVar103,auVar218);
      fVar74 = fVar106 * auVar111._0_4_ + fVar201 * auVar114._0_4_ + fVar58 * auVar125._0_4_;
      fVar97 = fVar107 * auVar111._4_4_ + fVar203 * auVar114._4_4_ + fVar28 * auVar125._4_4_;
      fVar202 = fVar162 * auVar111._8_4_ + fVar214 * auVar114._8_4_ + fVar48 * auVar125._8_4_;
      fVar204 = fVar189 * auVar111._12_4_ + fVar219 * auVar114._12_4_ + fVar51 * auVar125._12_4_;
      fVar108 = fVar106 * auVar206._0_4_ + fVar201 * auVar268._0_4_ + fVar58 * auVar232._0_4_;
      fVar220 = fVar107 * auVar206._4_4_ + fVar203 * auVar268._4_4_ + fVar28 * auVar232._4_4_;
      fVar222 = fVar162 * auVar206._8_4_ + fVar214 * auVar268._8_4_ + fVar48 * auVar232._8_4_;
      fVar224 = fVar189 * auVar206._12_4_ + fVar219 * auVar268._12_4_ + fVar51 * auVar232._12_4_;
      fVar109 = fVar106 * auVar255._0_4_ + fVar201 * auVar242._0_4_ + fVar58 * auVar99._0_4_;
      fVar121 = fVar107 * auVar255._4_4_ + fVar203 * auVar242._4_4_ + fVar28 * auVar99._4_4_;
      fVar122 = fVar162 * auVar255._8_4_ + fVar214 * auVar242._8_4_ + fVar48 * auVar99._8_4_;
      fVar123 = fVar189 * auVar255._12_4_ + fVar219 * auVar242._12_4_ + fVar51 * auVar99._12_4_;
    }
    else {
      fVar109 = (pIVar9->super_Geometry).fnumTimeSegments;
      fVar121 = (pIVar9->super_Geometry).time_range.lower;
      auVar76._0_4_ = (pIVar9->super_Geometry).time_range.upper - fVar121;
      auVar59._4_4_ = fVar121;
      auVar59._0_4_ = fVar121;
      auVar59._8_4_ = fVar121;
      auVar59._12_4_ = fVar121;
      auVar110._0_4_ = *(float *)(ray + 0x70) - fVar121;
      auVar110._4_4_ = *(float *)(ray + 0x74) - fVar121;
      auVar110._8_4_ = *(float *)(ray + 0x78) - fVar121;
      auVar110._12_4_ = *(float *)(ray + 0x7c) - fVar121;
      auVar76._4_4_ = auVar76._0_4_;
      auVar76._8_4_ = auVar76._0_4_;
      auVar76._12_4_ = auVar76._0_4_;
      auVar111 = divps(auVar110,auVar76);
      auVar112._0_4_ = auVar111._0_4_ * fVar109;
      auVar112._4_4_ = auVar111._4_4_ * fVar109;
      auVar112._8_4_ = auVar111._8_4_ * fVar109;
      auVar112._12_4_ = auVar111._12_4_ * fVar109;
      auVar111 = roundps(auVar59,auVar112,1);
      auVar30._0_4_ = fVar109 + -1.0;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      auVar111 = minps(auVar111,auVar30);
      auVar111 = maxps(auVar111,ZEXT816(0));
      fVar109 = auVar112._0_4_ - auVar111._0_4_;
      fVar121 = auVar112._4_4_ - auVar111._4_4_;
      fVar122 = auVar112._8_4_ - auVar111._8_4_;
      fVar123 = auVar112._12_4_ - auVar111._12_4_;
      iVar239 = (int)auVar111._0_4_;
      iVar247 = (int)auVar111._4_4_;
      iVar249 = (int)auVar111._8_4_;
      iVar251 = (int)auVar111._12_4_;
      local_a8 = CONCAT44(iVar247,iVar239);
      uStack_a0 = (RTCRayQueryContext *)CONCAT44(iVar251,iVar249);
      lVar25 = 0;
      if ((uVar24 & 0xff) != 0) {
        for (; ((uVar24 & 0xff) >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
        }
      }
      iVar27 = *(int *)((long)&local_a8 + lVar25 * 4);
      lVar25 = (long)iVar27;
      auVar31._0_4_ = -(uint)(iVar27 == iVar239);
      auVar31._4_4_ = -(uint)(iVar27 == iVar247);
      auVar31._8_4_ = -(uint)(iVar27 == iVar249);
      auVar31._12_4_ = -(uint)(iVar27 == iVar251);
      iVar27 = movmskps(uVar29 << 8,~auVar31 & auVar232);
      if (iVar27 == 0) {
        pAVar11 = pIVar9->local2world;
        pAVar2 = pAVar11 + lVar25;
        fVar74 = (pAVar2->l).vx.field_0.m128[0];
        fVar97 = (pAVar2->l).vx.field_0.m128[1];
        fVar202 = (pAVar2->l).vx.field_0.m128[2];
        pVVar3 = &pAVar11[lVar25].l.vy;
        fVar204 = (pVVar3->field_0).m128[0];
        fVar58 = (pVVar3->field_0).m128[1];
        fVar28 = (pVVar3->field_0).m128[2];
        pVVar3 = &pAVar11[lVar25].l.vz;
        fVar48 = (pVVar3->field_0).m128[0];
        fVar51 = (pVVar3->field_0).m128[1];
        fVar108 = (pVVar3->field_0).m128[2];
        pVVar3 = &pAVar11[lVar25].p;
        fVar220 = (pVVar3->field_0).m128[0];
        fVar222 = (pVVar3->field_0).m128[1];
        fVar224 = (pVVar3->field_0).m128[2];
        pAVar2 = pAVar11 + lVar25 + 1;
        fVar54 = (pAVar2->l).vx.field_0.m128[0];
        fVar57 = (pAVar2->l).vx.field_0.m128[1];
        fVar72 = (pAVar2->l).vx.field_0.m128[2];
        pVVar3 = &pAVar11[lVar25 + 1].l.vy;
        fVar73 = (pVVar3->field_0).m128[0];
        fVar75 = (pVVar3->field_0).m128[1];
        fVar94 = (pVVar3->field_0).m128[2];
        fVar284 = 1.0 - fVar109;
        fVar289 = 1.0 - fVar121;
        fVar291 = 1.0 - fVar122;
        fVar294 = 1.0 - fVar123;
        fVar192 = fVar74 * fVar284 + fVar54 * fVar109;
        fVar200 = fVar74 * fVar289 + fVar54 * fVar121;
        fVar201 = fVar74 * fVar291 + fVar54 * fVar122;
        fVar203 = fVar74 * fVar294 + fVar54 * fVar123;
        fVar231 = fVar97 * fVar284 + fVar57 * fVar109;
        fVar236 = fVar97 * fVar289 + fVar57 * fVar121;
        fVar237 = fVar97 * fVar291 + fVar57 * fVar122;
        fVar238 = fVar97 * fVar294 + fVar57 * fVar123;
        pVVar3 = &pAVar11[lVar25 + 1].l.vz;
        fVar74 = (pVVar3->field_0).m128[0];
        fVar97 = (pVVar3->field_0).m128[1];
        fVar54 = (pVVar3->field_0).m128[2];
        fVar225 = fVar202 * fVar284 + fVar72 * fVar109;
        fVar228 = fVar202 * fVar289 + fVar72 * fVar121;
        fVar229 = fVar202 * fVar291 + fVar72 * fVar122;
        fVar230 = fVar202 * fVar294 + fVar72 * fVar123;
        fVar214 = fVar204 * fVar284 + fVar73 * fVar109;
        fVar219 = fVar204 * fVar289 + fVar73 * fVar121;
        fVar221 = fVar204 * fVar291 + fVar73 * fVar122;
        fVar223 = fVar204 * fVar294 + fVar73 * fVar123;
        fVar162 = fVar58 * fVar284 + fVar75 * fVar109;
        fVar189 = fVar58 * fVar289 + fVar75 * fVar121;
        fVar190 = fVar58 * fVar291 + fVar75 * fVar122;
        fVar191 = fVar58 * fVar294 + fVar75 * fVar123;
        pVVar3 = &pAVar11[lVar25 + 1].p;
        fVar202 = (pVVar3->field_0).m128[0];
        fVar204 = (pVVar3->field_0).m128[1];
        fVar58 = (pVVar3->field_0).m128[2];
        fVar264 = fVar28 * fVar284 + fVar94 * fVar109;
        fVar275 = fVar28 * fVar289 + fVar94 * fVar121;
        fVar278 = fVar28 * fVar291 + fVar94 * fVar122;
        fVar281 = fVar28 * fVar294 + fVar94 * fVar123;
        fVar57 = fVar48 * fVar284 + fVar74 * fVar109;
        fVar72 = fVar48 * fVar289 + fVar74 * fVar121;
        fVar73 = fVar48 * fVar291 + fVar74 * fVar122;
        fVar74 = fVar48 * fVar294 + fVar74 * fVar123;
        fVar240 = fVar51 * fVar284 + fVar97 * fVar109;
        fVar248 = fVar51 * fVar289 + fVar97 * fVar121;
        fVar250 = fVar51 * fVar291 + fVar97 * fVar122;
        fVar252 = fVar51 * fVar294 + fVar97 * fVar123;
        fVar97 = fVar108 * fVar284 + fVar54 * fVar109;
        fVar106 = fVar108 * fVar289 + fVar54 * fVar121;
        fVar107 = fVar108 * fVar291 + fVar54 * fVar122;
        fVar108 = fVar108 * fVar294 + fVar54 * fVar123;
        fVar75 = fVar220 * fVar284 + fVar202 * fVar109;
        fVar94 = fVar220 * fVar289 + fVar202 * fVar121;
        fVar95 = fVar220 * fVar291 + fVar202 * fVar122;
        fVar96 = fVar220 * fVar294 + fVar202 * fVar123;
        fVar28 = fVar222 * fVar284 + fVar204 * fVar109;
        fVar48 = fVar222 * fVar289 + fVar204 * fVar121;
        fVar51 = fVar222 * fVar291 + fVar204 * fVar122;
        fVar54 = fVar222 * fVar294 + fVar204 * fVar123;
        fVar109 = fVar284 * fVar224 + fVar58 * fVar109;
        fVar121 = fVar289 * fVar224 + fVar58 * fVar121;
        fVar122 = fVar291 * fVar224 + fVar58 * fVar122;
        fVar123 = fVar294 * fVar224 + fVar58 * fVar123;
        auVar77._0_4_ = fVar162 * fVar97 - fVar264 * fVar240;
        auVar77._4_4_ = fVar189 * fVar106 - fVar275 * fVar248;
        auVar77._8_4_ = fVar190 * fVar107 - fVar278 * fVar250;
        auVar77._12_4_ = fVar191 * fVar108 - fVar281 * fVar252;
        auVar113._0_4_ = fVar264 * fVar57 - fVar214 * fVar97;
        auVar113._4_4_ = fVar275 * fVar72 - fVar219 * fVar106;
        auVar113._8_4_ = fVar278 * fVar73 - fVar221 * fVar107;
        auVar113._12_4_ = fVar281 * fVar74 - fVar223 * fVar108;
        auVar124._0_4_ = fVar214 * fVar240 - fVar162 * fVar57;
        auVar124._4_4_ = fVar219 * fVar248 - fVar189 * fVar72;
        auVar124._8_4_ = fVar221 * fVar250 - fVar190 * fVar73;
        auVar124._12_4_ = fVar223 * fVar252 - fVar191 * fVar74;
        auVar205._0_4_ = fVar225 * fVar240 - fVar231 * fVar97;
        auVar205._4_4_ = fVar228 * fVar248 - fVar236 * fVar106;
        auVar205._8_4_ = fVar229 * fVar250 - fVar237 * fVar107;
        auVar205._12_4_ = fVar230 * fVar252 - fVar238 * fVar108;
        auVar267._4_4_ = fVar106 * fVar200 - fVar228 * fVar72;
        auVar267._0_4_ = fVar97 * fVar192 - fVar225 * fVar57;
        auVar60._0_4_ = fVar57 * fVar231 - fVar240 * fVar192;
        auVar60._4_4_ = fVar72 * fVar236 - fVar248 * fVar200;
        auVar60._8_4_ = fVar73 * fVar237 - fVar250 * fVar201;
        auVar60._12_4_ = fVar74 * fVar238 - fVar252 * fVar203;
        auVar254._0_4_ = fVar231 * fVar264 - fVar225 * fVar162;
        auVar254._4_4_ = fVar236 * fVar275 - fVar228 * fVar189;
        auVar254._8_4_ = fVar237 * fVar278 - fVar229 * fVar190;
        auVar254._12_4_ = fVar238 * fVar281 - fVar230 * fVar191;
        auVar241._0_4_ = fVar225 * fVar214 - fVar264 * fVar192;
        auVar241._4_4_ = fVar228 * fVar219 - fVar275 * fVar200;
        auVar241._8_4_ = fVar229 * fVar221 - fVar278 * fVar201;
        auVar241._12_4_ = fVar230 * fVar223 - fVar281 * fVar203;
        auVar267._8_4_ = fVar107 * fVar201 - fVar229 * fVar73;
        auVar267._12_4_ = fVar108 * fVar203 - fVar230 * fVar74;
        auVar98._0_4_ = fVar162 * fVar192 - fVar214 * fVar231;
        auVar98._4_4_ = fVar189 * fVar200 - fVar219 * fVar236;
        auVar98._8_4_ = fVar190 * fVar201 - fVar221 * fVar237;
        auVar98._12_4_ = fVar191 * fVar203 - fVar223 * fVar238;
        auVar193._0_4_ =
             fVar192 * auVar77._0_4_ + fVar231 * auVar113._0_4_ + fVar225 * auVar124._0_4_;
        auVar193._4_4_ =
             fVar200 * auVar77._4_4_ + fVar236 * auVar113._4_4_ + fVar228 * auVar124._4_4_;
        auVar193._8_4_ =
             fVar201 * auVar77._8_4_ + fVar237 * auVar113._8_4_ + fVar229 * auVar124._8_4_;
        auVar193._12_4_ =
             fVar203 * auVar77._12_4_ + fVar238 * auVar113._12_4_ + fVar230 * auVar124._12_4_;
        auVar111 = divps(auVar77,auVar193);
        auVar206 = divps(auVar205,auVar193);
        auVar255 = divps(auVar254,auVar193);
        auVar114 = divps(auVar113,auVar193);
        auVar268 = divps(auVar267,auVar193);
        auVar242 = divps(auVar241,auVar193);
        auVar125 = divps(auVar124,auVar193);
        auVar232 = divps(auVar60,auVar193);
        auVar99 = divps(auVar98,auVar193);
        fVar74 = fVar75 * auVar111._0_4_ + fVar28 * auVar114._0_4_ + fVar109 * auVar125._0_4_;
        fVar97 = fVar94 * auVar111._4_4_ + fVar48 * auVar114._4_4_ + fVar121 * auVar125._4_4_;
        fVar202 = fVar95 * auVar111._8_4_ + fVar51 * auVar114._8_4_ + fVar122 * auVar125._8_4_;
        fVar204 = fVar96 * auVar111._12_4_ + fVar54 * auVar114._12_4_ + fVar123 * auVar125._12_4_;
        fVar108 = fVar75 * auVar206._0_4_ + fVar28 * auVar268._0_4_ + fVar109 * auVar232._0_4_;
        fVar220 = fVar94 * auVar206._4_4_ + fVar48 * auVar268._4_4_ + fVar121 * auVar232._4_4_;
        fVar222 = fVar95 * auVar206._8_4_ + fVar51 * auVar268._8_4_ + fVar122 * auVar232._8_4_;
        fVar224 = fVar96 * auVar206._12_4_ + fVar54 * auVar268._12_4_ + fVar123 * auVar232._12_4_;
        fVar109 = fVar75 * auVar255._0_4_ + fVar28 * auVar242._0_4_ + fVar109 * auVar99._0_4_;
        fVar121 = fVar94 * auVar255._4_4_ + fVar48 * auVar242._4_4_ + fVar121 * auVar99._4_4_;
        fVar122 = fVar95 * auVar255._8_4_ + fVar51 * auVar242._8_4_ + fVar122 * auVar99._8_4_;
        fVar123 = fVar96 * auVar255._12_4_ + fVar54 * auVar242._12_4_ + fVar123 * auVar99._12_4_;
      }
      else {
        while (uVar24 = movmskps((int)lVar25,auVar232), uVar24 != 0) {
          lVar25 = 0;
          if ((uVar24 & 0xff) != 0) {
            for (; ((uVar24 & 0xff) >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          iVar27 = *(int *)((long)&local_a8 + (long)(int)lVar25 * 4);
          lVar26 = (long)iVar27;
          auVar39._0_4_ = -(uint)(iVar27 == iVar239);
          auVar39._4_4_ = -(uint)(iVar27 == iVar247);
          auVar39._8_4_ = -(uint)(iVar27 == iVar249);
          auVar39._12_4_ = -(uint)(iVar27 == iVar251);
          auVar39 = auVar39 & auVar232;
          pAVar11 = pIVar9->local2world;
          lVar25 = lVar26 * 0x40;
          pAVar2 = pAVar11 + lVar26;
          uVar13 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar15 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          auVar127._4_4_ = uVar13;
          auVar127._0_4_ = uVar13;
          auVar127._8_4_ = uVar13;
          auVar127._12_4_ = uVar13;
          in_XMM8 = blendvps(in_XMM8,auVar127,auVar39);
          auVar128._4_4_ = uVar14;
          auVar128._0_4_ = uVar14;
          auVar128._8_4_ = uVar14;
          auVar128._12_4_ = uVar14;
          in_XMM10 = blendvps(in_XMM10,auVar128,auVar39);
          pVVar3 = &pAVar11[lVar26].l.vy;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar81._4_4_ = uVar15;
          auVar81._0_4_ = uVar15;
          auVar81._8_4_ = uVar15;
          auVar81._12_4_ = uVar15;
          in_XMM15 = blendvps(in_XMM15,auVar81,auVar39);
          auVar82._4_4_ = uVar13;
          auVar82._0_4_ = uVar13;
          auVar82._8_4_ = uVar13;
          auVar82._12_4_ = uVar13;
          in_XMM7 = blendvps(in_XMM7,auVar82,auVar39);
          auVar83._4_4_ = uVar14;
          auVar83._0_4_ = uVar14;
          auVar83._8_4_ = uVar14;
          auVar83._12_4_ = uVar14;
          auVar111 = blendvps(auVar111,auVar83,auVar39);
          pVVar3 = &pAVar11[lVar26].l.vz;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar129._4_4_ = uVar16;
          auVar129._0_4_ = uVar16;
          auVar129._8_4_ = uVar16;
          auVar129._12_4_ = uVar16;
          _local_238 = blendvps(_local_238,auVar129,auVar39);
          auVar130._4_4_ = uVar13;
          auVar130._0_4_ = uVar13;
          auVar130._8_4_ = uVar13;
          auVar130._12_4_ = uVar13;
          _local_228 = blendvps(_local_228,auVar130,auVar39);
          auVar131._4_4_ = uVar14;
          auVar131._0_4_ = uVar14;
          auVar131._8_4_ = uVar14;
          auVar131._12_4_ = uVar14;
          _local_248 = blendvps(_local_248,auVar131,auVar39);
          pVVar3 = &pAVar11[lVar26].p;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar84._4_4_ = uVar15;
          auVar84._0_4_ = uVar15;
          auVar84._8_4_ = uVar15;
          auVar84._12_4_ = uVar15;
          _local_258 = blendvps(_local_258,auVar84,auVar39);
          auVar85._4_4_ = uVar13;
          auVar85._0_4_ = uVar13;
          auVar85._8_4_ = uVar13;
          auVar85._12_4_ = uVar13;
          _local_268 = blendvps(_local_268,auVar85,auVar39);
          auVar86._4_4_ = uVar14;
          auVar86._0_4_ = uVar14;
          auVar86._8_4_ = uVar14;
          auVar86._12_4_ = uVar14;
          _local_218 = blendvps(_local_218,auVar86,auVar39);
          auVar132._4_4_ = uVar16;
          auVar132._0_4_ = uVar16;
          auVar132._8_4_ = uVar16;
          auVar132._12_4_ = uVar16;
          _local_1b8 = blendvps(_local_1b8,auVar132,auVar39);
          pAVar2 = pAVar11 + lVar26 + 1;
          uVar13 = *(undefined4 *)&(pAVar2->l).vx.field_0;
          uVar14 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 4);
          uVar15 = *(undefined4 *)((long)&(pAVar2->l).vx.field_0 + 8);
          auVar133._4_4_ = uVar13;
          auVar133._0_4_ = uVar13;
          auVar133._8_4_ = uVar13;
          auVar133._12_4_ = uVar13;
          in_XMM6 = blendvps(in_XMM6,auVar133,auVar39);
          auVar134._4_4_ = uVar14;
          auVar134._0_4_ = uVar14;
          auVar134._8_4_ = uVar14;
          auVar134._12_4_ = uVar14;
          in_XMM14 = blendvps(in_XMM14,auVar134,auVar39);
          pVVar3 = &pAVar11[lVar26 + 1].l.vy;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar87._4_4_ = uVar15;
          auVar87._0_4_ = uVar15;
          auVar87._8_4_ = uVar15;
          auVar87._12_4_ = uVar15;
          in_XMM13 = blendvps(in_XMM13,auVar87,auVar39);
          auVar88._4_4_ = uVar13;
          auVar88._0_4_ = uVar13;
          auVar88._8_4_ = uVar13;
          auVar88._12_4_ = uVar13;
          in_XMM9 = blendvps(in_XMM9,auVar88,auVar39);
          auVar89._4_4_ = uVar14;
          auVar89._0_4_ = uVar14;
          auVar89._8_4_ = uVar14;
          auVar89._12_4_ = uVar14;
          _local_1f8 = blendvps(_local_1f8,auVar89,auVar39);
          pVVar3 = &pAVar11[lVar26 + 1].l.vz;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar135._4_4_ = uVar16;
          auVar135._0_4_ = uVar16;
          auVar135._8_4_ = uVar16;
          auVar135._12_4_ = uVar16;
          _local_1d8 = blendvps(_local_1d8,auVar135,auVar39);
          auVar136._4_4_ = uVar13;
          auVar136._0_4_ = uVar13;
          auVar136._8_4_ = uVar13;
          auVar136._12_4_ = uVar13;
          _local_1e8 = blendvps(_local_1e8,auVar136,auVar39);
          auVar137._4_4_ = uVar14;
          auVar137._0_4_ = uVar14;
          auVar137._8_4_ = uVar14;
          auVar137._12_4_ = uVar14;
          _local_208 = blendvps(_local_208,auVar137,auVar39);
          auVar90._4_4_ = uVar15;
          auVar90._0_4_ = uVar15;
          auVar90._8_4_ = uVar15;
          auVar90._12_4_ = uVar15;
          _local_1c8 = blendvps(_local_1c8,auVar90,auVar39);
          pVVar3 = &pAVar11[lVar26 + 1].p;
          uVar13 = *(undefined4 *)&pVVar3->field_0;
          uVar14 = *(undefined4 *)((long)&pVVar3->field_0 + 4);
          uVar15 = *(undefined4 *)((long)&pVVar3->field_0 + 8);
          auVar138._4_4_ = uVar13;
          auVar138._0_4_ = uVar13;
          auVar138._8_4_ = uVar13;
          auVar138._12_4_ = uVar13;
          _local_1a8 = blendvps(_local_1a8,auVar138,auVar39);
          auVar139._4_4_ = uVar14;
          auVar139._0_4_ = uVar14;
          auVar139._8_4_ = uVar14;
          auVar139._12_4_ = uVar14;
          _local_198 = blendvps(_local_198,auVar139,auVar39);
          auVar91._4_4_ = uVar15;
          auVar91._0_4_ = uVar15;
          auVar91._8_4_ = uVar15;
          auVar91._12_4_ = uVar15;
          _local_188 = blendvps(_local_188,auVar91,auVar39);
          auVar232 = auVar232 ^ auVar39;
        }
        fVar108 = 1.0 - fVar109;
        fVar220 = 1.0 - fVar121;
        fVar222 = 1.0 - fVar122;
        fVar224 = 1.0 - fVar123;
        fVar221 = in_XMM8._0_4_ * fVar108 + in_XMM6._0_4_ * fVar109;
        fVar223 = in_XMM8._4_4_ * fVar220 + in_XMM6._4_4_ * fVar121;
        fVar225 = in_XMM8._8_4_ * fVar222 + in_XMM6._8_4_ * fVar122;
        fVar228 = in_XMM8._12_4_ * fVar224 + in_XMM6._12_4_ * fVar123;
        fVar201 = in_XMM10._0_4_ * fVar108 + in_XMM14._0_4_ * fVar109;
        fVar203 = in_XMM10._4_4_ * fVar220 + in_XMM14._4_4_ * fVar121;
        fVar214 = in_XMM10._8_4_ * fVar222 + in_XMM14._8_4_ * fVar122;
        fVar219 = in_XMM10._12_4_ * fVar224 + in_XMM14._12_4_ * fVar123;
        fVar237 = in_XMM15._0_4_ * fVar108 + in_XMM13._0_4_ * fVar109;
        fVar240 = in_XMM15._4_4_ * fVar220 + in_XMM13._4_4_ * fVar121;
        fVar250 = in_XMM15._8_4_ * fVar222 + in_XMM13._8_4_ * fVar122;
        fVar264 = in_XMM15._12_4_ * fVar224 + in_XMM13._12_4_ * fVar123;
        fVar75 = in_XMM7._0_4_ * fVar108 + in_XMM9._0_4_ * fVar109;
        fVar95 = in_XMM7._4_4_ * fVar220 + in_XMM9._4_4_ * fVar121;
        fVar106 = in_XMM7._8_4_ * fVar222 + in_XMM9._8_4_ * fVar122;
        fVar162 = in_XMM7._12_4_ * fVar224 + in_XMM9._12_4_ * fVar123;
        fVar74 = auVar111._0_4_ * fVar108 + (float)local_1f8._0_4_ * fVar109;
        fVar97 = auVar111._4_4_ * fVar220 + (float)local_1f8._4_4_ * fVar121;
        fVar202 = auVar111._8_4_ * fVar222 + fStack_1f0 * fVar122;
        fVar204 = auVar111._12_4_ * fVar224 + fStack_1ec * fVar123;
        fVar94 = (float)local_238._0_4_ * fVar108 + (float)local_1d8._0_4_ * fVar109;
        fVar96 = (float)local_238._4_4_ * fVar220 + (float)local_1d8._4_4_ * fVar121;
        fVar107 = (float)uStack_230 * fVar222 + fStack_1d0 * fVar122;
        fVar189 = uStack_230._4_4_ * fVar224 + fStack_1cc * fVar123;
        fVar238 = (float)local_228._0_4_ * fVar108 + (float)local_1e8._0_4_ * fVar109;
        fVar248 = (float)local_228._4_4_ * fVar220 + (float)local_1e8._4_4_ * fVar121;
        fVar252 = (float)uStack_220 * fVar222 + fStack_1e0 * fVar122;
        fVar275 = uStack_220._4_4_ * fVar224 + fStack_1dc * fVar123;
        fVar190 = (float)local_248._0_4_ * fVar108 + (float)local_208._0_4_ * fVar109;
        fVar191 = (float)local_248._4_4_ * fVar220 + (float)local_208._4_4_ * fVar121;
        fVar192 = (float)uStack_240 * fVar222 + fStack_200 * fVar122;
        fVar200 = uStack_240._4_4_ * fVar224 + fStack_1fc * fVar123;
        fVar229 = (float)local_258._0_4_ * fVar108 + (float)local_1c8._0_4_ * fVar109;
        fVar230 = (float)local_258._4_4_ * fVar220 + (float)local_1c8._4_4_ * fVar121;
        fVar231 = (float)uStack_250 * fVar222 + fStack_1c0 * fVar122;
        fVar236 = uStack_250._4_4_ * fVar224 + fStack_1bc * fVar123;
        fVar54 = (float)local_268._0_4_ * fVar108 + (float)local_1a8._0_4_ * fVar109;
        fVar57 = (float)local_268._4_4_ * fVar220 + (float)local_1a8._4_4_ * fVar121;
        fVar72 = (float)uStack_260 * fVar222 + fStack_1a0 * fVar122;
        fVar73 = uStack_260._4_4_ * fVar224 + fStack_19c * fVar123;
        fVar58 = (float)local_218._0_4_ * fVar108 + (float)local_198._0_4_ * fVar109;
        fVar28 = (float)local_218._4_4_ * fVar220 + (float)local_198._4_4_ * fVar121;
        fVar48 = (float)uStack_210 * fVar222 + fStack_190 * fVar122;
        fVar51 = uStack_210._4_4_ * fVar224 + fStack_18c * fVar123;
        fVar109 = fVar108 * (float)local_1b8._0_4_ + (float)local_188._0_4_ * fVar109;
        fVar121 = fVar220 * (float)local_1b8._4_4_ + (float)local_188._4_4_ * fVar121;
        fVar122 = fVar222 * fStack_1b0 + fStack_180 * fVar122;
        fVar123 = fVar224 * fStack_1ac + fStack_17c * fVar123;
        auVar92._0_4_ = fVar74 * fVar229 - fVar94 * fVar190;
        auVar92._4_4_ = fVar97 * fVar230 - fVar96 * fVar191;
        auVar92._8_4_ = fVar202 * fVar231 - fVar107 * fVar192;
        auVar92._12_4_ = fVar204 * fVar236 - fVar189 * fVar200;
        auVar119._0_4_ = fVar94 * fVar238 - fVar75 * fVar229;
        auVar119._4_4_ = fVar96 * fVar248 - fVar95 * fVar230;
        auVar119._8_4_ = fVar107 * fVar252 - fVar106 * fVar231;
        auVar119._12_4_ = fVar189 * fVar275 - fVar162 * fVar236;
        auVar140._0_4_ = fVar75 * fVar190 - fVar74 * fVar238;
        auVar140._4_4_ = fVar95 * fVar191 - fVar97 * fVar248;
        auVar140._8_4_ = fVar106 * fVar192 - fVar202 * fVar252;
        auVar140._12_4_ = fVar162 * fVar200 - fVar204 * fVar275;
        auVar210._0_4_ = fVar237 * fVar190 - fVar201 * fVar229;
        auVar210._4_4_ = fVar240 * fVar191 - fVar203 * fVar230;
        auVar210._8_4_ = fVar250 * fVar192 - fVar214 * fVar231;
        auVar210._12_4_ = fVar264 * fVar200 - fVar219 * fVar236;
        auVar271._0_4_ = fVar229 * fVar221 - fVar237 * fVar238;
        auVar271._4_4_ = fVar230 * fVar223 - fVar240 * fVar248;
        auVar271._8_4_ = fVar231 * fVar225 - fVar250 * fVar252;
        auVar271._12_4_ = fVar236 * fVar228 - fVar264 * fVar275;
        auVar288._0_4_ = fVar238 * fVar201 - fVar190 * fVar221;
        auVar288._4_4_ = fVar248 * fVar203 - fVar191 * fVar223;
        auVar288._8_4_ = fVar252 * fVar214 - fVar192 * fVar225;
        auVar288._12_4_ = fVar275 * fVar219 - fVar200 * fVar228;
        auVar257._0_4_ = fVar201 * fVar94 - fVar237 * fVar74;
        auVar257._4_4_ = fVar203 * fVar96 - fVar240 * fVar97;
        auVar257._8_4_ = fVar214 * fVar107 - fVar250 * fVar202;
        auVar257._12_4_ = fVar219 * fVar189 - fVar264 * fVar204;
        auVar245._0_4_ = fVar237 * fVar75 - fVar94 * fVar221;
        auVar245._4_4_ = fVar240 * fVar95 - fVar96 * fVar223;
        auVar245._8_4_ = fVar250 * fVar106 - fVar107 * fVar225;
        auVar245._12_4_ = fVar264 * fVar162 - fVar189 * fVar228;
        auVar104._0_4_ = fVar74 * fVar221 - fVar75 * fVar201;
        auVar104._4_4_ = fVar97 * fVar223 - fVar95 * fVar203;
        auVar104._8_4_ = fVar202 * fVar225 - fVar106 * fVar214;
        auVar104._12_4_ = fVar204 * fVar228 - fVar162 * fVar219;
        auVar235._0_4_ =
             fVar221 * auVar92._0_4_ + fVar201 * auVar119._0_4_ + fVar237 * auVar140._0_4_;
        auVar235._4_4_ =
             fVar223 * auVar92._4_4_ + fVar203 * auVar119._4_4_ + fVar240 * auVar140._4_4_;
        auVar235._8_4_ =
             fVar225 * auVar92._8_4_ + fVar214 * auVar119._8_4_ + fVar250 * auVar140._8_4_;
        auVar235._12_4_ =
             fVar228 * auVar92._12_4_ + fVar219 * auVar119._12_4_ + fVar264 * auVar140._12_4_;
        auVar111 = divps(auVar92,auVar235);
        auVar206 = divps(auVar210,auVar235);
        auVar255 = divps(auVar257,auVar235);
        auVar114 = divps(auVar119,auVar235);
        auVar268 = divps(auVar271,auVar235);
        auVar242 = divps(auVar245,auVar235);
        auVar125 = divps(auVar140,auVar235);
        auVar232 = divps(auVar288,auVar235);
        auVar99 = divps(auVar104,auVar235);
        fVar74 = fVar54 * auVar111._0_4_ + fVar58 * auVar114._0_4_ + fVar109 * auVar125._0_4_;
        fVar97 = fVar57 * auVar111._4_4_ + fVar28 * auVar114._4_4_ + fVar121 * auVar125._4_4_;
        fVar202 = fVar72 * auVar111._8_4_ + fVar48 * auVar114._8_4_ + fVar122 * auVar125._8_4_;
        fVar204 = fVar73 * auVar111._12_4_ + fVar51 * auVar114._12_4_ + fVar123 * auVar125._12_4_;
        fVar108 = fVar54 * auVar206._0_4_ + fVar58 * auVar268._0_4_ + fVar109 * auVar232._0_4_;
        fVar220 = fVar57 * auVar206._4_4_ + fVar28 * auVar268._4_4_ + fVar121 * auVar232._4_4_;
        fVar222 = fVar72 * auVar206._8_4_ + fVar48 * auVar268._8_4_ + fVar122 * auVar232._8_4_;
        fVar224 = fVar73 * auVar206._12_4_ + fVar51 * auVar268._12_4_ + fVar123 * auVar232._12_4_;
        fVar109 = fVar54 * auVar255._0_4_ + fVar58 * auVar242._0_4_ + fVar109 * auVar99._0_4_;
        fVar121 = fVar57 * auVar255._4_4_ + fVar28 * auVar242._4_4_ + fVar121 * auVar99._4_4_;
        fVar122 = fVar72 * auVar255._8_4_ + fVar48 * auVar242._8_4_ + fVar122 * auVar99._8_4_;
        fVar123 = fVar73 * auVar255._12_4_ + fVar51 * auVar242._12_4_ + fVar123 * auVar99._12_4_;
      }
    }
    pRVar1 = ray + 0x10;
    fVar58 = *(float *)pRVar1;
    fVar28 = *(float *)(ray + 0x14);
    fVar48 = *(float *)(ray + 0x18);
    auVar17 = *(undefined1 (*) [12])pRVar1;
    fVar51 = *(float *)(ray + 0x1c);
    auVar40 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x20;
    fVar54 = *(float *)pRVar1;
    fVar57 = *(float *)(ray + 0x24);
    fVar72 = *(float *)(ray + 0x28);
    auVar18 = *(undefined1 (*) [12])pRVar1;
    fVar73 = *(float *)(ray + 0x2c);
    auVar141 = *(undefined1 (*) [16])pRVar1;
    fVar75 = *(float *)ray;
    fVar94 = *(float *)(ray + 4);
    fVar95 = *(float *)(ray + 8);
    auVar19 = *(undefined1 (*) [12])ray;
    fVar96 = *(float *)(ray + 0xc);
    auVar142 = *(undefined1 (*) [16])ray;
    pRVar1 = ray + 0x40;
    fVar106 = *(float *)pRVar1;
    fVar107 = *(float *)(ray + 0x44);
    fVar162 = *(float *)(ray + 0x48);
    auVar22 = *(undefined1 (*) [12])pRVar1;
    fVar189 = *(float *)(ray + 0x4c);
    auVar145 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x50;
    fVar190 = *(float *)pRVar1;
    fVar191 = *(float *)(ray + 0x54);
    fVar192 = *(float *)(ray + 0x58);
    auVar21 = *(undefined1 (*) [12])pRVar1;
    fVar200 = *(float *)(ray + 0x5c);
    auVar144 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x60;
    fVar201 = *(float *)pRVar1;
    fVar203 = *(float *)(ray + 100);
    fVar214 = *(float *)(ray + 0x68);
    auVar20 = *(undefined1 (*) [12])pRVar1;
    fVar219 = *(float *)(ray + 0x6c);
    auVar143 = *(undefined1 (*) [16])pRVar1;
    *(float *)ray =
         auVar111._0_4_ * fVar75 + auVar114._0_4_ * fVar58 + auVar125._0_4_ * fVar54 + -fVar74;
    *(float *)(ray + 4) =
         auVar111._4_4_ * fVar94 + auVar114._4_4_ * fVar28 + auVar125._4_4_ * fVar57 + -fVar97;
    *(float *)(ray + 8) =
         auVar111._8_4_ * fVar95 + auVar114._8_4_ * fVar48 + auVar125._8_4_ * fVar72 + -fVar202;
    *(float *)(ray + 0xc) =
         auVar111._12_4_ * fVar96 + auVar114._12_4_ * fVar51 + auVar125._12_4_ * fVar73 + -fVar204;
    *(float *)(ray + 0x10) =
         auVar206._0_4_ * fVar75 + auVar268._0_4_ * fVar58 + auVar232._0_4_ * fVar54 + -fVar108;
    *(float *)(ray + 0x14) =
         auVar206._4_4_ * fVar94 + auVar268._4_4_ * fVar28 + auVar232._4_4_ * fVar57 + -fVar220;
    *(float *)(ray + 0x18) =
         auVar206._8_4_ * fVar95 + auVar268._8_4_ * fVar48 + auVar232._8_4_ * fVar72 + -fVar222;
    *(float *)(ray + 0x1c) =
         auVar206._12_4_ * fVar96 + auVar268._12_4_ * fVar51 + auVar232._12_4_ * fVar73 + -fVar224;
    *(float *)(ray + 0x20) =
         auVar255._0_4_ * fVar75 + auVar242._0_4_ * fVar58 + auVar99._0_4_ * fVar54 + -fVar109;
    *(float *)(ray + 0x24) =
         auVar255._4_4_ * fVar94 + auVar242._4_4_ * fVar28 + auVar99._4_4_ * fVar57 + -fVar121;
    *(float *)(ray + 0x28) =
         auVar255._8_4_ * fVar95 + auVar242._8_4_ * fVar48 + auVar99._8_4_ * fVar72 + -fVar122;
    *(float *)(ray + 0x2c) =
         auVar255._12_4_ * fVar96 + auVar242._12_4_ * fVar51 + auVar99._12_4_ * fVar73 + -fVar123;
    *(float *)(ray + 0x40) =
         auVar111._0_4_ * fVar106 + auVar114._0_4_ * fVar190 + auVar125._0_4_ * fVar201;
    *(float *)(ray + 0x44) =
         auVar111._4_4_ * fVar107 + auVar114._4_4_ * fVar191 + auVar125._4_4_ * fVar203;
    *(float *)(ray + 0x48) =
         auVar111._8_4_ * fVar162 + auVar114._8_4_ * fVar192 + auVar125._8_4_ * fVar214;
    *(float *)(ray + 0x4c) =
         auVar111._12_4_ * fVar189 + auVar114._12_4_ * fVar200 + auVar125._12_4_ * fVar219;
    *(float *)(ray + 0x50) =
         auVar206._0_4_ * fVar106 + auVar268._0_4_ * fVar190 + auVar232._0_4_ * fVar201;
    *(float *)(ray + 0x54) =
         auVar206._4_4_ * fVar107 + auVar268._4_4_ * fVar191 + auVar232._4_4_ * fVar203;
    *(float *)(ray + 0x58) =
         auVar206._8_4_ * fVar162 + auVar268._8_4_ * fVar192 + auVar232._8_4_ * fVar214;
    *(float *)(ray + 0x5c) =
         auVar206._12_4_ * fVar189 + auVar268._12_4_ * fVar200 + auVar232._12_4_ * fVar219;
    *(float *)(ray + 0x60) =
         auVar255._0_4_ * fVar106 + auVar242._0_4_ * fVar190 + auVar99._0_4_ * fVar201;
    *(float *)(ray + 100) =
         auVar255._4_4_ * fVar107 + auVar242._4_4_ * fVar191 + auVar99._4_4_ * fVar203;
    *(float *)(ray + 0x68) =
         auVar255._8_4_ * fVar162 + auVar242._8_4_ * fVar192 + auVar99._8_4_ * fVar214;
    *(float *)(ray + 0x6c) =
         auVar255._12_4_ * fVar189 + auVar242._12_4_ * fVar200 + auVar99._12_4_ * fVar219;
    local_a8 = *(long *)&(pIVar9->super_Geometry).field_0x58;
    local_98 = context->args;
    local_28 = local_58._0_8_;
    uStack_20 = local_58._8_8_;
    uStack_a0 = pRVar10;
    local_58 = auVar23;
    (**(code **)(local_a8 + 0x98))(&local_28,local_a8 + 0x58,ray);
    local_218 = auVar19._0_8_;
    uStack_210 = auVar142._8_8_;
    *(undefined1 (*) [8])ray = local_218;
    *(undefined8 *)(ray + 8) = uStack_210;
    local_258 = auVar17._0_8_;
    uStack_250 = auVar40._8_8_;
    *(undefined1 (*) [8])(ray + 0x10) = local_258;
    *(undefined8 *)(ray + 0x18) = uStack_250;
    local_268 = auVar18._0_8_;
    uStack_260 = auVar141._8_8_;
    *(undefined1 (*) [8])(ray + 0x20) = local_268;
    *(undefined8 *)(ray + 0x28) = uStack_260;
    local_248 = auVar22._0_8_;
    uStack_240 = auVar145._8_8_;
    *(undefined1 (*) [8])(ray + 0x40) = local_248;
    *(undefined8 *)(ray + 0x48) = uStack_240;
    local_238 = auVar21._0_8_;
    uStack_230 = auVar144._8_8_;
    *(undefined1 (*) [8])(ray + 0x50) = local_238;
    *(undefined8 *)(ray + 0x58) = uStack_230;
    local_228 = auVar20._0_8_;
    uStack_220 = auVar143._8_8_;
    *(undefined1 (*) [8])(ray + 0x60) = local_228;
    *(undefined8 *)(ray + 0x68) = uStack_220;
    pRVar10->instID[0] = 0xffffffff;
    pRVar10->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }